

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  int iVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  long lVar87;
  uint uVar88;
  uint uVar89;
  long lVar90;
  uint uVar91;
  long lVar92;
  ulong uVar93;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  Geometry *pGVar94;
  uint uVar95;
  byte bVar96;
  ulong uVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar148;
  float fVar150;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar103 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar104 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar154;
  undefined4 uVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar175;
  float fVar184;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar185;
  float fVar190;
  float fVar191;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  Precalculations *local_6a8;
  undefined1 local_6a0 [16];
  RTCFilterFunctionNArguments local_688;
  Geometry *local_658;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  LinearSpace3fa *local_4a8;
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  int local_290;
  int iStack_28c;
  int iStack_288;
  int iStack_284;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_230 [16];
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar97 = (ulong)(byte)PVar11;
  fVar185 = *(float *)(prim + uVar97 * 0x19 + 0x12);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar100 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar103 = vinsertps_avx(auVar100,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar167 = vsubps_avx(auVar102,*(undefined1 (*) [16])(prim + uVar97 * 0x19 + 6));
  fVar174 = fVar185 * auVar167._0_4_;
  fVar154 = fVar185 * auVar103._0_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar97 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar102);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar97 * 5 + 6);
  auVar110 = vpmovsxbd_avx2(auVar100);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar97 * 6 + 6);
  auVar123 = vpmovsxbd_avx2(auVar213);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 * 0xb + 6);
  auVar122 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar116 = vpmovsxbd_avx2(auVar7);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar113 = vcvtdq2ps_avx(auVar116);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar97 + 6);
  auVar111 = vpmovsxbd_avx2(auVar8);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar93 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar121 = vpmovsxbd_avx2(auVar9);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 + uVar97 + 6);
  auVar114 = vpmovsxbd_avx2(auVar10);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar86 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar86 + 6);
  auVar109 = vpmovsxbd_avx2(auVar101);
  auVar115 = vcvtdq2ps_avx(auVar109);
  auVar208._4_4_ = fVar154;
  auVar208._0_4_ = fVar154;
  auVar208._8_4_ = fVar154;
  auVar208._12_4_ = fVar154;
  auVar208._16_4_ = fVar154;
  auVar208._20_4_ = fVar154;
  auVar208._24_4_ = fVar154;
  auVar208._28_4_ = fVar154;
  auVar211._8_4_ = 1;
  auVar211._0_8_ = 0x100000001;
  auVar211._12_4_ = 1;
  auVar211._16_4_ = 1;
  auVar211._20_4_ = 1;
  auVar211._24_4_ = 1;
  auVar211._28_4_ = 1;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar185 * auVar103._12_4_,
                                CONCAT48(fVar185 * auVar103._8_4_,
                                         CONCAT44(fVar185 * auVar103._4_4_,fVar154))));
  auVar117 = vpermps_avx2(auVar211,auVar118);
  auVar108 = vpermps_avx512vl(auVar107,auVar118);
  fVar154 = auVar108._0_4_;
  fVar190 = auVar108._4_4_;
  auVar118._4_4_ = fVar190 * auVar123._4_4_;
  auVar118._0_4_ = fVar154 * auVar123._0_4_;
  fVar191 = auVar108._8_4_;
  auVar118._8_4_ = fVar191 * auVar123._8_4_;
  fVar175 = auVar108._12_4_;
  auVar118._12_4_ = fVar175 * auVar123._12_4_;
  fVar182 = auVar108._16_4_;
  auVar118._16_4_ = fVar182 * auVar123._16_4_;
  fVar183 = auVar108._20_4_;
  auVar118._20_4_ = fVar183 * auVar123._20_4_;
  fVar184 = auVar108._24_4_;
  auVar118._24_4_ = fVar184 * auVar123._24_4_;
  auVar118._28_4_ = auVar116._28_4_;
  auVar116._4_4_ = auVar111._4_4_ * fVar190;
  auVar116._0_4_ = auVar111._0_4_ * fVar154;
  auVar116._8_4_ = auVar111._8_4_ * fVar191;
  auVar116._12_4_ = auVar111._12_4_ * fVar175;
  auVar116._16_4_ = auVar111._16_4_ * fVar182;
  auVar116._20_4_ = auVar111._20_4_ * fVar183;
  auVar116._24_4_ = auVar111._24_4_ * fVar184;
  auVar116._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar115._4_4_ * fVar190;
  auVar109._0_4_ = auVar115._0_4_ * fVar154;
  auVar109._8_4_ = auVar115._8_4_ * fVar191;
  auVar109._12_4_ = auVar115._12_4_ * fVar175;
  auVar109._16_4_ = auVar115._16_4_ * fVar182;
  auVar109._20_4_ = auVar115._20_4_ * fVar183;
  auVar109._24_4_ = auVar115._24_4_ * fVar184;
  auVar109._28_4_ = auVar108._28_4_;
  auVar102 = vfmadd231ps_fma(auVar118,auVar117,auVar110);
  auVar100 = vfmadd231ps_fma(auVar116,auVar117,auVar113);
  auVar213 = vfmadd231ps_fma(auVar109,auVar114,auVar117);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar208,auVar112);
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar208,auVar122);
  auVar213 = vfmadd231ps_fma(ZEXT1632(auVar213),auVar121,auVar208);
  auVar209._4_4_ = fVar174;
  auVar209._0_4_ = fVar174;
  auVar209._8_4_ = fVar174;
  auVar209._12_4_ = fVar174;
  auVar209._16_4_ = fVar174;
  auVar209._20_4_ = fVar174;
  auVar209._24_4_ = fVar174;
  auVar209._28_4_ = fVar174;
  auVar109 = ZEXT1632(CONCAT412(fVar185 * auVar167._12_4_,
                                CONCAT48(fVar185 * auVar167._8_4_,
                                         CONCAT44(fVar185 * auVar167._4_4_,fVar174))));
  auVar116 = vpermps_avx2(auVar211,auVar109);
  auVar109 = vpermps_avx512vl(auVar107,auVar109);
  fVar185 = auVar109._0_4_;
  fVar154 = auVar109._4_4_;
  auVar117._4_4_ = fVar154 * auVar123._4_4_;
  auVar117._0_4_ = fVar185 * auVar123._0_4_;
  fVar190 = auVar109._8_4_;
  auVar117._8_4_ = fVar190 * auVar123._8_4_;
  fVar191 = auVar109._12_4_;
  auVar117._12_4_ = fVar191 * auVar123._12_4_;
  fVar175 = auVar109._16_4_;
  auVar117._16_4_ = fVar175 * auVar123._16_4_;
  fVar182 = auVar109._20_4_;
  auVar117._20_4_ = fVar182 * auVar123._20_4_;
  fVar183 = auVar109._24_4_;
  auVar117._24_4_ = fVar183 * auVar123._24_4_;
  auVar117._28_4_ = 1;
  auVar107._4_4_ = auVar111._4_4_ * fVar154;
  auVar107._0_4_ = auVar111._0_4_ * fVar185;
  auVar107._8_4_ = auVar111._8_4_ * fVar190;
  auVar107._12_4_ = auVar111._12_4_ * fVar191;
  auVar107._16_4_ = auVar111._16_4_ * fVar175;
  auVar107._20_4_ = auVar111._20_4_ * fVar182;
  auVar107._24_4_ = auVar111._24_4_ * fVar183;
  auVar107._28_4_ = auVar123._28_4_;
  auVar111._4_4_ = auVar115._4_4_ * fVar154;
  auVar111._0_4_ = auVar115._0_4_ * fVar185;
  auVar111._8_4_ = auVar115._8_4_ * fVar190;
  auVar111._12_4_ = auVar115._12_4_ * fVar191;
  auVar111._16_4_ = auVar115._16_4_ * fVar175;
  auVar111._20_4_ = auVar115._20_4_ * fVar182;
  auVar111._24_4_ = auVar115._24_4_ * fVar183;
  auVar111._28_4_ = auVar109._28_4_;
  auVar6 = vfmadd231ps_fma(auVar117,auVar116,auVar110);
  auVar7 = vfmadd231ps_fma(auVar107,auVar116,auVar113);
  auVar8 = vfmadd231ps_fma(auVar111,auVar116,auVar114);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar209,auVar112);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar209,auVar122);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar200._16_4_ = 0x7fffffff;
  auVar200._20_4_ = 0x7fffffff;
  auVar200._24_4_ = 0x7fffffff;
  auVar200._28_4_ = 0x7fffffff;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar209,auVar121);
  auVar112 = vandps_avx(ZEXT1632(auVar102),auVar200);
  auVar196._8_4_ = 0x219392ef;
  auVar196._0_8_ = 0x219392ef219392ef;
  auVar196._12_4_ = 0x219392ef;
  auVar196._16_4_ = 0x219392ef;
  auVar196._20_4_ = 0x219392ef;
  auVar196._24_4_ = 0x219392ef;
  auVar196._28_4_ = 0x219392ef;
  uVar93 = vcmpps_avx512vl(auVar112,auVar196,1);
  bVar16 = (bool)((byte)uVar93 & 1);
  auVar108._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._0_4_;
  bVar16 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._4_4_;
  bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._8_4_;
  bVar16 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar100),auVar200);
  uVar93 = vcmpps_avx512vl(auVar112,auVar196,1);
  bVar16 = (bool)((byte)uVar93 & 1);
  auVar119._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar100._0_4_;
  bVar16 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar100._4_4_;
  bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar100._8_4_;
  bVar16 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar100._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar213),auVar200);
  uVar93 = vcmpps_avx512vl(auVar112,auVar196,1);
  bVar16 = (bool)((byte)uVar93 & 1);
  auVar112._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar213._0_4_;
  bVar16 = (bool)((byte)(uVar93 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar213._4_4_;
  bVar16 = (bool)((byte)(uVar93 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar213._8_4_;
  bVar16 = (bool)((byte)(uVar93 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar213._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar93 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar93 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar93 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar93 >> 7) * 0x219392ef;
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar197._8_4_ = 0x3f800000;
  auVar197._0_8_ = &DAT_3f8000003f800000;
  auVar197._12_4_ = 0x3f800000;
  auVar197._16_4_ = 0x3f800000;
  auVar197._20_4_ = 0x3f800000;
  auVar197._24_4_ = 0x3f800000;
  auVar197._28_4_ = 0x3f800000;
  auVar102 = vfnmadd213ps_fma(auVar108,auVar110,auVar197);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar119);
  auVar100 = vfnmadd213ps_fma(auVar119,auVar110,auVar197);
  auVar100 = vfmadd132ps_fma(ZEXT1632(auVar100),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar112);
  auVar213 = vfnmadd213ps_fma(auVar112,auVar110,auVar197);
  auVar213 = vfmadd132ps_fma(ZEXT1632(auVar213),auVar110,auVar110);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar121._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar121._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar121._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar121._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar121._16_4_ = auVar112._16_4_ * 0.0;
  auVar121._20_4_ = auVar112._20_4_ * 0.0;
  auVar121._24_4_ = auVar112._24_4_ * 0.0;
  auVar121._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 9 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar111 = vpbroadcastd_avx512vl();
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar135._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar135._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar135._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar135._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar135._16_4_ = auVar112._16_4_ * 0.0;
  auVar135._20_4_ = auVar112._20_4_ * 0.0;
  auVar135._24_4_ = auVar112._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar97 * -2 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar7));
  auVar114._4_4_ = auVar100._4_4_ * auVar112._4_4_;
  auVar114._0_4_ = auVar100._0_4_ * auVar112._0_4_;
  auVar114._8_4_ = auVar100._8_4_ * auVar112._8_4_;
  auVar114._12_4_ = auVar100._12_4_ * auVar112._12_4_;
  auVar114._16_4_ = auVar112._16_4_ * 0.0;
  auVar114._20_4_ = auVar112._20_4_ * 0.0;
  auVar114._24_4_ = auVar112._24_4_ * 0.0;
  auVar114._28_4_ = auVar112._28_4_;
  auVar112 = vcvtdq2ps_avx(auVar110);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar7));
  auVar134._0_4_ = auVar100._0_4_ * auVar112._0_4_;
  auVar134._4_4_ = auVar100._4_4_ * auVar112._4_4_;
  auVar134._8_4_ = auVar100._8_4_ * auVar112._8_4_;
  auVar134._12_4_ = auVar100._12_4_ * auVar112._12_4_;
  auVar134._16_4_ = auVar112._16_4_ * 0.0;
  auVar134._20_4_ = auVar112._20_4_ * 0.0;
  auVar134._24_4_ = auVar112._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + uVar97 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar8));
  auVar115._4_4_ = auVar112._4_4_ * auVar213._4_4_;
  auVar115._0_4_ = auVar112._0_4_ * auVar213._0_4_;
  auVar115._8_4_ = auVar112._8_4_ * auVar213._8_4_;
  auVar115._12_4_ = auVar112._12_4_ * auVar213._12_4_;
  auVar115._16_4_ = auVar112._16_4_ * 0.0;
  auVar115._20_4_ = auVar112._20_4_ * 0.0;
  auVar115._24_4_ = auVar112._24_4_ * 0.0;
  auVar115._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar97 * 0x17 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar8));
  auVar120._0_4_ = auVar213._0_4_ * auVar112._0_4_;
  auVar120._4_4_ = auVar213._4_4_ * auVar112._4_4_;
  auVar120._8_4_ = auVar213._8_4_ * auVar112._8_4_;
  auVar120._12_4_ = auVar213._12_4_ * auVar112._12_4_;
  auVar120._16_4_ = auVar112._16_4_ * 0.0;
  auVar120._20_4_ = auVar112._20_4_ * 0.0;
  auVar120._24_4_ = auVar112._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar112 = vpminsd_avx2(auVar121,auVar135);
  auVar110 = vpminsd_avx2(auVar114,auVar134);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110 = vpminsd_avx2(auVar115,auVar120);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar123._4_4_ = uVar155;
  auVar123._0_4_ = uVar155;
  auVar123._8_4_ = uVar155;
  auVar123._12_4_ = uVar155;
  auVar123._16_4_ = uVar155;
  auVar123._20_4_ = uVar155;
  auVar123._24_4_ = uVar155;
  auVar123._28_4_ = uVar155;
  auVar110 = vmaxps_avx512vl(auVar110,auVar123);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar112,auVar110);
  auVar112 = vpmaxsd_avx2(auVar121,auVar135);
  auVar110 = vpmaxsd_avx2(auVar114,auVar134);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar110 = vpmaxsd_avx2(auVar115,auVar120);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar122._4_4_ = uVar155;
  auVar122._0_4_ = uVar155;
  auVar122._8_4_ = uVar155;
  auVar122._12_4_ = uVar155;
  auVar122._16_4_ = uVar155;
  auVar122._20_4_ = uVar155;
  auVar122._24_4_ = uVar155;
  auVar122._28_4_ = uVar155;
  auVar110 = vminps_avx512vl(auVar110,auVar122);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar113._8_4_ = 0x3f800003;
  auVar113._0_8_ = 0x3f8000033f800003;
  auVar113._12_4_ = 0x3f800003;
  auVar113._16_4_ = 0x3f800003;
  auVar113._20_4_ = 0x3f800003;
  auVar113._24_4_ = 0x3f800003;
  auVar113._28_4_ = 0x3f800003;
  auVar112 = vmulps_avx512vl(auVar112,auVar113);
  uVar24 = vpcmpgtd_avx512vl(auVar111,_DAT_0205a920);
  uVar23 = vcmpps_avx512vl(local_80,auVar112,2);
  if ((byte)((byte)uVar23 & (byte)uVar24) != 0) {
    uVar93 = (ulong)(byte)((byte)uVar23 & (byte)uVar24);
    local_4a8 = pre->ray_space + k;
    local_3f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6a8 = pre;
    do {
      lVar92 = 0;
      for (uVar86 = uVar93; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        lVar92 = lVar92 + 1;
      }
      uVar95 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar92 * 4 + 6);
      pGVar94 = (context->scene->geometries).items[uVar95].ptr;
      uVar86 = (ulong)*(uint *)(*(long *)&pGVar94->field_0x58 +
                               (ulong)uVar12 *
                               pGVar94[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar87 = (long)pGVar94[1].intersectionFilterN * uVar86;
      lVar92 = *(long *)&pGVar94[1].time_range.upper;
      local_6a0 = *(undefined1 (*) [16])(lVar92 + lVar87);
      lVar90 = (long)pGVar94[1].intersectionFilterN * (uVar86 + 1);
      _local_620 = *(undefined1 (*) [16])(lVar92 + lVar90);
      iVar13 = (int)pGVar94[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar72 = (long)iVar13 * 0x44;
      auVar167._8_4_ = 0xbeaaaaab;
      auVar167._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar167._12_4_ = 0xbeaaaaab;
      local_610 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar94[2].intersectionFilterN +
                                    uVar86 * (long)pGVar94[2].pointQueryFunc),local_6a0,auVar167);
      local_630 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar94[2].intersectionFilterN +
                                   (long)pGVar94[2].pointQueryFunc * (uVar86 + 1)),_local_620,
                                  auVar167);
      auVar213 = vsubps_avx(local_6a0,auVar102);
      uVar155 = auVar213._0_4_;
      auVar168._4_4_ = uVar155;
      auVar168._0_4_ = uVar155;
      auVar168._8_4_ = uVar155;
      auVar168._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar213,auVar213,0x55);
      aVar4 = (local_4a8->vx).field_0;
      aVar5 = (local_4a8->vy).field_0;
      fVar185 = (local_4a8->vz).field_0.m128[0];
      fVar154 = *(float *)((long)&(local_4a8->vz).field_0 + 4);
      fVar190 = *(float *)((long)&(local_4a8->vz).field_0 + 8);
      fVar191 = *(float *)((long)&(local_4a8->vz).field_0 + 0xc);
      auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
      auVar205._0_4_ = fVar185 * auVar213._0_4_;
      auVar205._4_4_ = fVar154 * auVar213._4_4_;
      auVar205._8_4_ = fVar190 * auVar213._8_4_;
      auVar205._12_4_ = fVar191 * auVar213._12_4_;
      auVar100 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar5,auVar100);
      auVar6 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar168);
      auVar213 = vsubps_avx(local_610,auVar102);
      uVar155 = auVar213._0_4_;
      auVar169._4_4_ = uVar155;
      auVar169._0_4_ = uVar155;
      auVar169._8_4_ = uVar155;
      auVar169._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar213,auVar213,0x55);
      auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
      auVar206._0_4_ = fVar185 * auVar213._0_4_;
      auVar206._4_4_ = fVar154 * auVar213._4_4_;
      auVar206._8_4_ = fVar190 * auVar213._8_4_;
      auVar206._12_4_ = fVar191 * auVar213._12_4_;
      auVar100 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar100);
      auVar7 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar169);
      auVar213 = vsubps_avx(local_630,auVar102);
      uVar155 = auVar213._0_4_;
      auVar104._4_4_ = uVar155;
      auVar104._0_4_ = uVar155;
      auVar104._8_4_ = uVar155;
      auVar104._12_4_ = uVar155;
      auVar100 = vshufps_avx(auVar213,auVar213,0x55);
      auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
      auVar207._0_4_ = fVar185 * auVar213._0_4_;
      auVar207._4_4_ = fVar154 * auVar213._4_4_;
      auVar207._8_4_ = fVar190 * auVar213._8_4_;
      auVar207._12_4_ = fVar191 * auVar213._12_4_;
      auVar100 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar100);
      auVar213 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar4,auVar104);
      auVar100 = vsubps_avx(_local_620,auVar102);
      uVar155 = auVar100._0_4_;
      auVar103._4_4_ = uVar155;
      auVar103._0_4_ = uVar155;
      auVar103._8_4_ = uVar155;
      auVar103._12_4_ = uVar155;
      auVar102 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar210._0_4_ = fVar185 * auVar100._0_4_;
      auVar210._4_4_ = fVar154 * auVar100._4_4_;
      auVar210._8_4_ = fVar190 * auVar100._8_4_;
      auVar210._12_4_ = fVar191 * auVar100._12_4_;
      auVar102 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar5,auVar102);
      auVar8 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar103);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar72);
      uVar155 = auVar6._0_4_;
      local_420._4_4_ = uVar155;
      local_420._0_4_ = uVar155;
      local_420._8_4_ = uVar155;
      local_420._12_4_ = uVar155;
      local_420._16_4_ = uVar155;
      local_420._20_4_ = uVar155;
      local_420._24_4_ = uVar155;
      local_420._28_4_ = uVar155;
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x484);
      auVar160._8_4_ = 1;
      auVar160._0_8_ = 0x100000001;
      auVar160._12_4_ = 1;
      auVar160._16_4_ = 1;
      auVar160._20_4_ = 1;
      auVar160._24_4_ = 1;
      auVar160._28_4_ = 1;
      local_440 = vpermps_avx512vl(auVar160,ZEXT1632(auVar6));
      local_460 = vbroadcastss_avx512vl(auVar7);
      local_480 = vpermps_avx512vl(auVar160,ZEXT1632(auVar7));
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x908);
      local_520 = vbroadcastss_avx512vl(auVar213);
      auVar218 = ZEXT3264(local_520);
      local_540 = vpermps_avx512vl(auVar160,ZEXT1632(auVar213));
      auVar219 = ZEXT3264(local_540);
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0xd8c);
      local_560 = vbroadcastss_avx512vl(auVar8);
      auVar220 = ZEXT3264(local_560);
      local_580 = vpermps_avx512vl(auVar160,ZEXT1632(auVar8));
      auVar221 = ZEXT3264(local_580);
      auVar113 = vmulps_avx512vl(local_560,auVar122);
      auVar111 = vmulps_avx512vl(local_580,auVar122);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar123,local_520);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar123,local_540);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,local_460);
      auVar114 = vfmadd231ps_avx512vl(auVar111,auVar110,local_480);
      auVar9 = vfmadd231ps_fma(auVar113,auVar112,local_420);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar72);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x484);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x908);
      auVar115 = vfmadd231ps_avx512vl(auVar114,auVar112,local_440);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0xd8c);
      auVar116 = vmulps_avx512vl(local_560,auVar114);
      auVar109 = vmulps_avx512vl(local_580,auVar114);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_520);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar121,local_540);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,local_460);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar111,local_480);
      auVar10 = vfmadd231ps_fma(auVar116,auVar113,local_420);
      auVar116 = vfmadd231ps_avx512vl(auVar109,auVar113,local_440);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar9));
      auVar117 = vsubps_avx512vl(auVar116,auVar115);
      auVar118 = vmulps_avx512vl(auVar115,auVar109);
      auVar107 = vmulps_avx512vl(ZEXT1632(auVar9),auVar117);
      auVar118 = vsubps_avx512vl(auVar118,auVar107);
      auVar102 = vshufps_avx(local_610,local_610,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar102);
      auVar102 = vshufps_avx(local_630,local_630,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar102);
      _local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar92 + 0xc + lVar90)));
      auVar107 = vmulps_avx512vl(_local_e0,auVar122);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar123,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar92 + 0xc + lVar87)));
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar112,local_100);
      auVar108 = vmulps_avx512vl(_local_e0,auVar114);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar121,local_c0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_a0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_100);
      auVar119 = vmulps_avx512vl(auVar117,auVar117);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar109,auVar109);
      auVar120 = vmaxps_avx512vl(auVar107,auVar108);
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      auVar119 = vmulps_avx512vl(auVar120,auVar119);
      auVar118 = vmulps_avx512vl(auVar118,auVar118);
      uVar23 = vcmpps_avx512vl(auVar118,auVar119,2);
      auVar102 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar101 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vblendps_avx(auVar7,local_610,8);
      auVar102 = vandps_avx512vl(auVar102,auVar100);
      auVar101 = vmaxps_avx512vl(auVar101,auVar102);
      auVar102 = vblendps_avx(auVar213,local_630,8);
      auVar103 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vinsertps_avx512f(auVar8,local_e0._0_16_,0x30);
      auVar102 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vmaxps_avx512vl(auVar103,auVar102);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar100 = vmovshdup_avx(auVar102);
      auVar100 = vmaxss_avx(auVar100,auVar102);
      auVar102 = vshufpd_avx(auVar102,auVar102,1);
      auVar102 = vmaxss_avx(auVar102,auVar100);
      _local_3e0 = vcvtsi2ss_avx512f(in_ZMM23._0_16_,iVar13);
      auVar203._0_4_ = local_3e0._0_4_;
      auVar203._4_4_ = auVar203._0_4_;
      auVar203._8_4_ = auVar203._0_4_;
      auVar203._12_4_ = auVar203._0_4_;
      auVar203._16_4_ = auVar203._0_4_;
      auVar203._20_4_ = auVar203._0_4_;
      auVar203._24_4_ = auVar203._0_4_;
      auVar203._28_4_ = auVar203._0_4_;
      uVar24 = vcmpps_avx512vl(auVar203,_DAT_02020f40,0xe);
      bVar96 = (byte)uVar23 & (byte)uVar24;
      auVar102 = vmulss_avx512f(auVar102,ZEXT416(0x35000000));
      auVar202._8_4_ = 2;
      auVar202._0_8_ = 0x200000002;
      auVar202._12_4_ = 2;
      auVar202._16_4_ = 2;
      auVar202._20_4_ = 2;
      auVar202._24_4_ = 2;
      auVar202._28_4_ = 2;
      local_160 = vpermps_avx2(auVar202,ZEXT1632(auVar6));
      local_180 = vpermps_avx2(auVar202,ZEXT1632(auVar7));
      local_120 = vpermps_avx512vl(auVar202,ZEXT1632(auVar213));
      local_140 = vpermps_avx512vl(auVar202,ZEXT1632(auVar8));
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x30);
      local_1e0 = auVar102._0_4_;
      uStack_1dc = auVar102._4_4_;
      uStack_1d8 = auVar102._8_4_;
      uStack_1d4 = auVar102._12_4_;
      if (bVar96 == 0) {
        auVar102 = vxorps_avx512vl(auVar114._0_16_,auVar114._0_16_);
        auVar214 = ZEXT1664(auVar102);
        auVar215 = ZEXT3264(local_420);
        auVar216 = ZEXT3264(local_440);
        auVar217 = ZEXT3264(local_460);
        auVar222 = ZEXT3264(local_480);
      }
      else {
        uStack_49c = 0;
        uStack_498 = 0;
        uStack_494 = 0;
        auVar114 = vmulps_avx512vl(local_140,auVar114);
        auVar121 = vfmadd213ps_avx512vl(auVar121,local_120,auVar114);
        in_ZMM23 = ZEXT3264(local_180);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar121);
        auVar111 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
        auVar122 = vmulps_avx512vl(local_140,auVar122);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_120,auVar122);
        auVar121 = vfmadd213ps_avx512vl(auVar110,local_180,auVar123);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1694);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar72 + 0x1f9c);
        auVar121 = vfmadd213ps_avx512vl(auVar112,local_160,auVar121);
        auVar112 = vmulps_avx512vl(local_560,auVar113);
        auVar114 = vmulps_avx512vl(local_580,auVar113);
        auVar113 = vmulps_avx512vl(local_140,auVar113);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar122,local_520);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_540);
        auVar122 = vfmadd231ps_avx512vl(auVar113,local_120,auVar122);
        auVar100 = vfmadd231ps_fma(auVar112,auVar123,local_460);
        auVar222 = ZEXT3264(local_480);
        auVar112 = vfmadd231ps_avx512vl(auVar114,auVar123,local_480);
        auVar113 = vfmadd231ps_avx512vl(auVar122,local_180,auVar123);
        auVar114 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar110,local_420);
        auVar118 = vfmadd231ps_avx512vl(auVar112,auVar110,local_440);
        auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1b18);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_160,auVar110);
        auVar110 = vmulps_avx512vl(local_560,auVar122);
        auVar119 = vmulps_avx512vl(local_580,auVar122);
        auVar122 = vmulps_avx512vl(local_140,auVar122);
        auVar120 = vfmadd231ps_avx512vl(auVar110,auVar123,local_520);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_540);
        auVar123 = vfmadd231ps_avx512vl(auVar122,local_120,auVar123);
        auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar72 + 0x1694);
        auVar122 = vfmadd231ps_avx512vl(auVar120,auVar110,local_460);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,local_480);
        auVar110 = vfmadd231ps_avx512vl(auVar123,local_180,auVar110);
        auVar123 = vfmadd231ps_avx512vl(auVar122,auVar112,local_420);
        auVar122 = vfmadd231ps_avx512vl(auVar119,auVar112,local_440);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_160,auVar112);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar114,auVar119);
        vandps_avx512vl(auVar118,auVar119);
        auVar112 = vmaxps_avx(auVar119,auVar119);
        vandps_avx512vl(auVar113,auVar119);
        auVar112 = vmaxps_avx(auVar112,auVar119);
        auVar113 = vbroadcastss_avx512vl(auVar102);
        uVar86 = vcmpps_avx512vl(auVar112,auVar113,1);
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar124._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar114._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar114._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar114._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar114._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar114._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar114._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar114._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar124._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar114._28_4_;
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar125._0_4_ = (float)((uint)bVar16 * auVar117._0_4_ | (uint)!bVar16 * auVar118._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar118._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar118._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar118._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * auVar118._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * auVar118._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * auVar118._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar125._28_4_ = (uint)bVar16 * auVar117._28_4_ | (uint)!bVar16 * auVar118._28_4_;
        vandps_avx512vl(auVar123,auVar119);
        vandps_avx512vl(auVar122,auVar119);
        auVar112 = vmaxps_avx(auVar125,auVar125);
        vandps_avx512vl(auVar110,auVar119);
        auVar112 = vmaxps_avx(auVar112,auVar125);
        uVar86 = vcmpps_avx512vl(auVar112,auVar113,1);
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar126._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar123._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar123._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar123._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar123._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar123._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar123._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar123._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar126._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar123._28_4_;
        bVar16 = (bool)((byte)uVar86 & 1);
        auVar127._0_4_ = (float)((uint)bVar16 * auVar117._0_4_ | (uint)!bVar16 * auVar122._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar16 * auVar117._4_4_ | (uint)!bVar16 * auVar122._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar16 * auVar117._8_4_ | (uint)!bVar16 * auVar122._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar16 * auVar117._12_4_ | (uint)!bVar16 * auVar122._12_4_);
        bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar16 * auVar117._16_4_ | (uint)!bVar16 * auVar122._16_4_);
        bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar16 * auVar117._20_4_ | (uint)!bVar16 * auVar122._20_4_);
        bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar16 * auVar117._24_4_ | (uint)!bVar16 * auVar122._24_4_);
        bVar16 = SUB81(uVar86 >> 7,0);
        auVar127._28_4_ = (uint)bVar16 * auVar117._28_4_ | (uint)!bVar16 * auVar122._28_4_;
        auVar104 = vxorps_avx512vl(local_160._0_16_,local_160._0_16_);
        auVar214 = ZEXT1664(auVar104);
        auVar112 = vfmadd213ps_avx512vl(auVar124,auVar124,ZEXT1632(auVar104));
        auVar102 = vfmadd231ps_fma(auVar112,auVar125,auVar125);
        auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar102),auVar123);
        fVar185 = auVar112._0_4_;
        fVar154 = auVar112._4_4_;
        fVar190 = auVar112._8_4_;
        fVar191 = auVar112._12_4_;
        fVar175 = auVar112._16_4_;
        fVar182 = auVar112._20_4_;
        fVar183 = auVar112._24_4_;
        auVar36._4_4_ = fVar154 * fVar154 * fVar154 * auVar122._4_4_;
        auVar36._0_4_ = fVar185 * fVar185 * fVar185 * auVar122._0_4_;
        auVar36._8_4_ = fVar190 * fVar190 * fVar190 * auVar122._8_4_;
        auVar36._12_4_ = fVar191 * fVar191 * fVar191 * auVar122._12_4_;
        auVar36._16_4_ = fVar175 * fVar175 * fVar175 * auVar122._16_4_;
        auVar36._20_4_ = fVar182 * fVar182 * fVar182 * auVar122._20_4_;
        auVar36._24_4_ = fVar183 * fVar183 * fVar183 * auVar122._24_4_;
        auVar36._28_4_ = auVar110._28_4_;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar112 = vfmadd231ps_avx512vl(auVar36,auVar110,auVar112);
        auVar37._4_4_ = auVar125._4_4_ * auVar112._4_4_;
        auVar37._0_4_ = auVar125._0_4_ * auVar112._0_4_;
        auVar37._8_4_ = auVar125._8_4_ * auVar112._8_4_;
        auVar37._12_4_ = auVar125._12_4_ * auVar112._12_4_;
        auVar37._16_4_ = auVar125._16_4_ * auVar112._16_4_;
        auVar37._20_4_ = auVar125._20_4_ * auVar112._20_4_;
        auVar37._24_4_ = auVar125._24_4_ * auVar112._24_4_;
        auVar37._28_4_ = auVar122._28_4_;
        auVar38._4_4_ = auVar112._4_4_ * -auVar124._4_4_;
        auVar38._0_4_ = auVar112._0_4_ * -auVar124._0_4_;
        auVar38._8_4_ = auVar112._8_4_ * -auVar124._8_4_;
        auVar38._12_4_ = auVar112._12_4_ * -auVar124._12_4_;
        auVar38._16_4_ = auVar112._16_4_ * -auVar124._16_4_;
        auVar38._20_4_ = auVar112._20_4_ * -auVar124._20_4_;
        auVar38._24_4_ = auVar112._24_4_ * -auVar124._24_4_;
        auVar38._28_4_ = auVar125._28_4_;
        auVar122 = vmulps_avx512vl(auVar112,ZEXT1632(auVar104));
        auVar114 = ZEXT1632(auVar104);
        auVar113 = vfmadd213ps_avx512vl(auVar126,auVar126,auVar114);
        auVar102 = vfmadd231ps_fma(auVar113,auVar127,auVar127);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
        auVar123 = vmulps_avx512vl(ZEXT1632(auVar102),auVar123);
        fVar185 = auVar113._0_4_;
        fVar154 = auVar113._4_4_;
        fVar190 = auVar113._8_4_;
        fVar191 = auVar113._12_4_;
        fVar175 = auVar113._16_4_;
        fVar182 = auVar113._20_4_;
        fVar183 = auVar113._24_4_;
        auVar39._4_4_ = fVar154 * fVar154 * fVar154 * auVar123._4_4_;
        auVar39._0_4_ = fVar185 * fVar185 * fVar185 * auVar123._0_4_;
        auVar39._8_4_ = fVar190 * fVar190 * fVar190 * auVar123._8_4_;
        auVar39._12_4_ = fVar191 * fVar191 * fVar191 * auVar123._12_4_;
        auVar39._16_4_ = fVar175 * fVar175 * fVar175 * auVar123._16_4_;
        auVar39._20_4_ = fVar182 * fVar182 * fVar182 * auVar123._20_4_;
        auVar39._24_4_ = fVar183 * fVar183 * fVar183 * auVar123._24_4_;
        auVar39._28_4_ = auVar112._28_4_;
        auVar112 = vfmadd231ps_avx512vl(auVar39,auVar110,auVar113);
        auVar40._4_4_ = auVar127._4_4_ * auVar112._4_4_;
        auVar40._0_4_ = auVar127._0_4_ * auVar112._0_4_;
        auVar40._8_4_ = auVar127._8_4_ * auVar112._8_4_;
        auVar40._12_4_ = auVar127._12_4_ * auVar112._12_4_;
        auVar40._16_4_ = auVar127._16_4_ * auVar112._16_4_;
        auVar40._20_4_ = auVar127._20_4_ * auVar112._20_4_;
        auVar40._24_4_ = auVar127._24_4_ * auVar112._24_4_;
        auVar40._28_4_ = auVar123._28_4_;
        auVar41._4_4_ = auVar112._4_4_ * -auVar126._4_4_;
        auVar41._0_4_ = auVar112._0_4_ * -auVar126._0_4_;
        auVar41._8_4_ = auVar112._8_4_ * -auVar126._8_4_;
        auVar41._12_4_ = auVar112._12_4_ * -auVar126._12_4_;
        auVar41._16_4_ = auVar112._16_4_ * -auVar126._16_4_;
        auVar41._20_4_ = auVar112._20_4_ * -auVar126._20_4_;
        auVar41._24_4_ = auVar112._24_4_ * -auVar126._24_4_;
        auVar41._28_4_ = auVar113._28_4_;
        auVar112 = vmulps_avx512vl(auVar112,auVar114);
        auVar102 = vfmadd213ps_fma(auVar37,auVar107,ZEXT1632(auVar9));
        auVar100 = vfmadd213ps_fma(auVar38,auVar107,auVar115);
        auVar123 = vfmadd213ps_avx512vl(auVar122,auVar107,auVar121);
        auVar113 = vfmadd213ps_avx512vl(auVar40,auVar108,ZEXT1632(auVar10));
        auVar101 = vfnmadd213ps_fma(auVar37,auVar107,ZEXT1632(auVar9));
        auVar213 = vfmadd213ps_fma(auVar41,auVar108,auVar116);
        auVar103 = vfnmadd213ps_fma(auVar38,auVar107,auVar115);
        auVar6 = vfmadd213ps_fma(auVar112,auVar108,auVar111);
        auVar168 = vfnmadd231ps_fma(auVar121,auVar107,auVar122);
        auVar10 = vfnmadd213ps_fma(auVar40,auVar108,ZEXT1632(auVar10));
        auVar167 = vfnmadd213ps_fma(auVar41,auVar108,auVar116);
        auVar169 = vfnmadd231ps_fma(auVar111,auVar108,auVar112);
        auVar111 = vsubps_avx512vl(auVar113,ZEXT1632(auVar101));
        auVar112 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar103));
        auVar110 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar168));
        auVar42._4_4_ = auVar112._4_4_ * auVar168._4_4_;
        auVar42._0_4_ = auVar112._0_4_ * auVar168._0_4_;
        auVar42._8_4_ = auVar112._8_4_ * auVar168._8_4_;
        auVar42._12_4_ = auVar112._12_4_ * auVar168._12_4_;
        auVar42._16_4_ = auVar112._16_4_ * 0.0;
        auVar42._20_4_ = auVar112._20_4_ * 0.0;
        auVar42._24_4_ = auVar112._24_4_ * 0.0;
        auVar42._28_4_ = auVar122._28_4_;
        auVar7 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar103),auVar110);
        auVar43._4_4_ = auVar110._4_4_ * auVar101._4_4_;
        auVar43._0_4_ = auVar110._0_4_ * auVar101._0_4_;
        auVar43._8_4_ = auVar110._8_4_ * auVar101._8_4_;
        auVar43._12_4_ = auVar110._12_4_ * auVar101._12_4_;
        auVar43._16_4_ = auVar110._16_4_ * 0.0;
        auVar43._20_4_ = auVar110._20_4_ * 0.0;
        auVar43._24_4_ = auVar110._24_4_ * 0.0;
        auVar43._28_4_ = auVar110._28_4_;
        auVar8 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar168),auVar111);
        auVar44._4_4_ = auVar103._4_4_ * auVar111._4_4_;
        auVar44._0_4_ = auVar103._0_4_ * auVar111._0_4_;
        auVar44._8_4_ = auVar103._8_4_ * auVar111._8_4_;
        auVar44._12_4_ = auVar103._12_4_ * auVar111._12_4_;
        auVar44._16_4_ = auVar111._16_4_ * 0.0;
        auVar44._20_4_ = auVar111._20_4_ * 0.0;
        auVar44._24_4_ = auVar111._24_4_ * 0.0;
        auVar44._28_4_ = auVar111._28_4_;
        auVar9 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar101),auVar112);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar114,ZEXT1632(auVar8));
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,ZEXT1632(auVar7));
        auVar117 = ZEXT1632(auVar104);
        uVar86 = vcmpps_avx512vl(auVar112,auVar117,2);
        bVar85 = (byte)uVar86;
        fVar98 = (float)((uint)(bVar85 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar10._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar148 = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar10._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar150 = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar10._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar152 = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar10._12_4_);
        auVar121 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar98))));
        fVar99 = (float)((uint)(bVar85 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar85 & 1) * auVar167._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        fVar149 = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar167._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        fVar151 = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar167._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        fVar153 = (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar167._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar99))));
        auVar128._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar169._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar16 * auVar123._4_4_ | (uint)!bVar16 * auVar169._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar16 * auVar123._8_4_ | (uint)!bVar16 * auVar169._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar16 * auVar123._12_4_ | (uint)!bVar16 * auVar169._12_4_);
        fVar154 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar123._16_4_);
        auVar128._16_4_ = fVar154;
        fVar185 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar123._20_4_);
        auVar128._20_4_ = fVar185;
        fVar190 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar123._24_4_);
        auVar128._24_4_ = fVar190;
        iVar1 = (uint)(byte)(uVar86 >> 7) * auVar123._28_4_;
        auVar128._28_4_ = iVar1;
        auVar112 = vblendmps_avx512vl(ZEXT1632(auVar101),auVar113);
        auVar129._0_4_ =
             (uint)(bVar85 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar102._0_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar102._4_4_;
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar102._8_4_;
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar102._12_4_;
        auVar129._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_;
        auVar129._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_;
        auVar129._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_;
        auVar129._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
        auVar112 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar213));
        auVar130._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar7._0_4_)
        ;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar7._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar7._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar7._12_4_);
        fVar191 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_);
        auVar130._16_4_ = fVar191;
        fVar175 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_);
        auVar130._20_4_ = fVar175;
        fVar182 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_);
        auVar130._24_4_ = fVar182;
        auVar130._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
        auVar112 = vblendmps_avx512vl(ZEXT1632(auVar168),ZEXT1632(auVar6));
        auVar131._0_4_ =
             (float)((uint)(bVar85 & 1) * auVar112._0_4_ |
                    (uint)!(bool)(bVar85 & 1) * auVar100._0_4_);
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar100._4_4_);
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar100._8_4_);
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar100._12_4_);
        fVar174 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_);
        auVar131._16_4_ = fVar174;
        fVar183 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_);
        auVar131._20_4_ = fVar183;
        fVar184 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_);
        auVar131._24_4_ = fVar184;
        iVar2 = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
        auVar131._28_4_ = iVar2;
        auVar132._0_4_ =
             (uint)(bVar85 & 1) * (int)auVar101._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar113._0_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar16 * (int)auVar101._4_4_ | (uint)!bVar16 * auVar113._4_4_;
        bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar16 * (int)auVar101._8_4_ | (uint)!bVar16 * auVar113._8_4_;
        bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar16 * (int)auVar101._12_4_ | (uint)!bVar16 * auVar113._12_4_;
        auVar132._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar113._16_4_;
        auVar132._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar113._20_4_;
        auVar132._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar113._24_4_;
        auVar132._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar113._28_4_;
        bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar86 >> 3) & 1);
        bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar115 = vsubps_avx512vl(auVar132,auVar121);
        auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar103._12_4_ |
                                                 (uint)!bVar20 * auVar213._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar103._8_4_ |
                                                          (uint)!bVar18 * auVar213._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar16 * auVar213._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar213._0_4_)))),auVar114);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar168._12_4_ |
                                                 (uint)!bVar21 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar19 * (int)auVar168._8_4_ |
                                                          (uint)!bVar19 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar17 *
                                                                   (int)auVar168._4_4_ |
                                                                   (uint)!bVar17 * auVar6._4_4_,
                                                                   (uint)(bVar85 & 1) *
                                                                   (int)auVar168._0_4_ |
                                                                   (uint)!(bool)(bVar85 & 1) *
                                                                   auVar6._0_4_)))),auVar128);
        auVar122 = vsubps_avx(auVar121,auVar129);
        auVar113 = vsubps_avx(auVar114,auVar130);
        auVar111 = vsubps_avx(auVar128,auVar131);
        auVar45._4_4_ = auVar123._4_4_ * fVar148;
        auVar45._0_4_ = auVar123._0_4_ * fVar98;
        auVar45._8_4_ = auVar123._8_4_ * fVar150;
        auVar45._12_4_ = auVar123._12_4_ * fVar152;
        auVar45._16_4_ = auVar123._16_4_ * 0.0;
        auVar45._20_4_ = auVar123._20_4_ * 0.0;
        auVar45._24_4_ = auVar123._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar45,auVar128,auVar115);
        auVar180._0_4_ = fVar99 * auVar115._0_4_;
        auVar180._4_4_ = fVar149 * auVar115._4_4_;
        auVar180._8_4_ = fVar151 * auVar115._8_4_;
        auVar180._12_4_ = fVar153 * auVar115._12_4_;
        auVar180._16_4_ = auVar115._16_4_ * 0.0;
        auVar180._20_4_ = auVar115._20_4_ * 0.0;
        auVar180._24_4_ = auVar115._24_4_ * 0.0;
        auVar180._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar180,auVar121,auVar110);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar117,ZEXT1632(auVar102));
        auVar186._0_4_ = auVar110._0_4_ * auVar128._0_4_;
        auVar186._4_4_ = auVar110._4_4_ * auVar128._4_4_;
        auVar186._8_4_ = auVar110._8_4_ * auVar128._8_4_;
        auVar186._12_4_ = auVar110._12_4_ * auVar128._12_4_;
        auVar186._16_4_ = auVar110._16_4_ * fVar154;
        auVar186._20_4_ = auVar110._20_4_ * fVar185;
        auVar186._24_4_ = auVar110._24_4_ * fVar190;
        auVar186._28_4_ = 0;
        auVar102 = vfmsub231ps_fma(auVar186,auVar114,auVar123);
        auVar116 = vfmadd231ps_avx512vl(auVar112,auVar117,ZEXT1632(auVar102));
        auVar112 = vmulps_avx512vl(auVar111,auVar129);
        auVar112 = vfmsub231ps_avx512vl(auVar112,auVar122,auVar131);
        auVar46._4_4_ = auVar113._4_4_ * auVar131._4_4_;
        auVar46._0_4_ = auVar113._0_4_ * auVar131._0_4_;
        auVar46._8_4_ = auVar113._8_4_ * auVar131._8_4_;
        auVar46._12_4_ = auVar113._12_4_ * auVar131._12_4_;
        auVar46._16_4_ = auVar113._16_4_ * fVar174;
        auVar46._20_4_ = auVar113._20_4_ * fVar183;
        auVar46._24_4_ = auVar113._24_4_ * fVar184;
        auVar46._28_4_ = iVar2;
        auVar102 = vfmsub231ps_fma(auVar46,auVar130,auVar111);
        auVar187._0_4_ = auVar130._0_4_ * auVar122._0_4_;
        auVar187._4_4_ = auVar130._4_4_ * auVar122._4_4_;
        auVar187._8_4_ = auVar130._8_4_ * auVar122._8_4_;
        auVar187._12_4_ = auVar130._12_4_ * auVar122._12_4_;
        auVar187._16_4_ = fVar191 * auVar122._16_4_;
        auVar187._20_4_ = fVar175 * auVar122._20_4_;
        auVar187._24_4_ = fVar182 * auVar122._24_4_;
        auVar187._28_4_ = 0;
        auVar100 = vfmsub231ps_fma(auVar187,auVar113,auVar129);
        auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar117,auVar112);
        auVar109 = vfmadd231ps_avx512vl(auVar112,auVar117,ZEXT1632(auVar102));
        auVar112 = vmaxps_avx(auVar116,auVar109);
        uVar23 = vcmpps_avx512vl(auVar112,auVar117,2);
        bVar96 = bVar96 & (byte)uVar23;
        auVar215 = ZEXT3264(local_420);
        auVar216 = ZEXT3264(local_440);
        auVar217 = ZEXT3264(local_460);
        if (bVar96 == 0) {
          bVar96 = 0;
        }
        else {
          auVar47._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar47._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar47._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar47._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar47._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar47._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar47._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar47._28_4_ = auVar112._28_4_;
          auVar213 = vfmsub231ps_fma(auVar47,auVar113,auVar123);
          auVar48._4_4_ = auVar123._4_4_ * auVar122._4_4_;
          auVar48._0_4_ = auVar123._0_4_ * auVar122._0_4_;
          auVar48._8_4_ = auVar123._8_4_ * auVar122._8_4_;
          auVar48._12_4_ = auVar123._12_4_ * auVar122._12_4_;
          auVar48._16_4_ = auVar123._16_4_ * auVar122._16_4_;
          auVar48._20_4_ = auVar123._20_4_ * auVar122._20_4_;
          auVar48._24_4_ = auVar123._24_4_ * auVar122._24_4_;
          auVar48._28_4_ = auVar123._28_4_;
          auVar100 = vfmsub231ps_fma(auVar48,auVar115,auVar111);
          auVar49._4_4_ = auVar113._4_4_ * auVar115._4_4_;
          auVar49._0_4_ = auVar113._0_4_ * auVar115._0_4_;
          auVar49._8_4_ = auVar113._8_4_ * auVar115._8_4_;
          auVar49._12_4_ = auVar113._12_4_ * auVar115._12_4_;
          auVar49._16_4_ = auVar113._16_4_ * auVar115._16_4_;
          auVar49._20_4_ = auVar113._20_4_ * auVar115._20_4_;
          auVar49._24_4_ = auVar113._24_4_ * auVar115._24_4_;
          auVar49._28_4_ = auVar113._28_4_;
          auVar6 = vfmsub231ps_fma(auVar49,auVar122,auVar110);
          auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar6));
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar213),auVar117);
          auVar110 = vrcp14ps_avx512vl(auVar112);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_avx512vl(auVar110,auVar112,auVar25);
          auVar102 = vfmadd132ps_fma(auVar123,auVar110,auVar110);
          auVar50._4_4_ = auVar6._4_4_ * auVar128._4_4_;
          auVar50._0_4_ = auVar6._0_4_ * auVar128._0_4_;
          auVar50._8_4_ = auVar6._8_4_ * auVar128._8_4_;
          auVar50._12_4_ = auVar6._12_4_ * auVar128._12_4_;
          auVar50._16_4_ = fVar154 * 0.0;
          auVar50._20_4_ = fVar185 * 0.0;
          auVar50._24_4_ = fVar190 * 0.0;
          auVar50._28_4_ = iVar1;
          auVar100 = vfmadd231ps_fma(auVar50,auVar114,ZEXT1632(auVar100));
          auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar121,ZEXT1632(auVar213));
          fVar185 = auVar102._0_4_;
          fVar154 = auVar102._4_4_;
          fVar190 = auVar102._8_4_;
          fVar191 = auVar102._12_4_;
          auVar110 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar191,
                                        CONCAT48(auVar100._8_4_ * fVar190,
                                                 CONCAT44(auVar100._4_4_ * fVar154,
                                                          auVar100._0_4_ * fVar185))));
          auVar201._4_4_ = uVar155;
          auVar201._0_4_ = uVar155;
          auVar201._8_4_ = uVar155;
          auVar201._12_4_ = uVar155;
          auVar201._16_4_ = uVar155;
          auVar201._20_4_ = uVar155;
          auVar201._24_4_ = uVar155;
          auVar201._28_4_ = uVar155;
          uVar23 = vcmpps_avx512vl(auVar201,auVar110,2);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar3;
          auVar26._0_4_ = uVar3;
          auVar26._8_4_ = uVar3;
          auVar26._12_4_ = uVar3;
          auVar26._16_4_ = uVar3;
          auVar26._20_4_ = uVar3;
          auVar26._24_4_ = uVar3;
          auVar26._28_4_ = uVar3;
          uVar24 = vcmpps_avx512vl(auVar110,auVar26,2);
          bVar96 = (byte)uVar23 & (byte)uVar24 & bVar96;
          if (bVar96 != 0) {
            uVar23 = vcmpps_avx512vl(auVar112,auVar117,4);
            if ((bVar96 & (byte)uVar23) != 0) {
              bVar96 = bVar96 & (byte)uVar23;
              fVar175 = auVar116._0_4_ * fVar185;
              fVar182 = auVar116._4_4_ * fVar154;
              auVar51._4_4_ = fVar182;
              auVar51._0_4_ = fVar175;
              fVar183 = auVar116._8_4_ * fVar190;
              auVar51._8_4_ = fVar183;
              fVar184 = auVar116._12_4_ * fVar191;
              auVar51._12_4_ = fVar184;
              fVar174 = auVar116._16_4_ * 0.0;
              auVar51._16_4_ = fVar174;
              fVar98 = auVar116._20_4_ * 0.0;
              auVar51._20_4_ = fVar98;
              fVar99 = auVar116._24_4_ * 0.0;
              auVar51._24_4_ = fVar99;
              auVar51._28_4_ = auVar116._28_4_;
              fVar185 = auVar109._0_4_ * fVar185;
              fVar154 = auVar109._4_4_ * fVar154;
              auVar52._4_4_ = fVar154;
              auVar52._0_4_ = fVar185;
              fVar190 = auVar109._8_4_ * fVar190;
              auVar52._8_4_ = fVar190;
              fVar191 = auVar109._12_4_ * fVar191;
              auVar52._12_4_ = fVar191;
              fVar148 = auVar109._16_4_ * 0.0;
              auVar52._16_4_ = fVar148;
              fVar149 = auVar109._20_4_ * 0.0;
              auVar52._20_4_ = fVar149;
              fVar150 = auVar109._24_4_ * 0.0;
              auVar52._24_4_ = fVar150;
              auVar52._28_4_ = auVar109._28_4_;
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = &DAT_3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar198,auVar51);
              local_5a0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar175 | (uint)!(bool)(bVar85 & 1) * auVar112._0_4_;
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar16 * (int)fVar182 | (uint)!bVar16 * auVar112._4_4_;
              bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar16 * (int)fVar183 | (uint)!bVar16 * auVar112._8_4_;
              bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar16 * (int)fVar184 | (uint)!bVar16 * auVar112._12_4_;
              bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar112._16_4_;
              bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar16 * (int)fVar98 | (uint)!bVar16 * auVar112._20_4_;
              bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar16 * (int)fVar99 | (uint)!bVar16 * auVar112._24_4_;
              bVar16 = SUB81(uVar86 >> 7,0);
              local_5a0._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar112._28_4_;
              auVar112 = vsubps_avx(auVar198,auVar52);
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar86 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar86 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar86 >> 6) & 1);
              bVar22 = SUB81(uVar86 >> 7,0);
              local_1c0._4_4_ = (uint)bVar16 * (int)fVar154 | (uint)!bVar16 * auVar112._4_4_;
              local_1c0._0_4_ =
                   (uint)(bVar85 & 1) * (int)fVar185 | (uint)!(bool)(bVar85 & 1) * auVar112._0_4_;
              local_1c0._8_4_ = (uint)bVar17 * (int)fVar190 | (uint)!bVar17 * auVar112._8_4_;
              local_1c0._12_4_ = (uint)bVar18 * (int)fVar191 | (uint)!bVar18 * auVar112._12_4_;
              local_1c0._16_4_ = (uint)bVar19 * (int)fVar148 | (uint)!bVar19 * auVar112._16_4_;
              local_1c0._20_4_ = (uint)bVar20 * (int)fVar149 | (uint)!bVar20 * auVar112._20_4_;
              local_1c0._24_4_ = (uint)bVar21 * (int)fVar150 | (uint)!bVar21 * auVar112._24_4_;
              local_1c0._28_4_ = (uint)bVar22 * auVar109._28_4_ | (uint)!bVar22 * auVar112._28_4_;
              local_5c0 = auVar110;
              goto LAB_01d8846a;
            }
          }
          bVar96 = 0;
        }
LAB_01d8846a:
        auVar221 = ZEXT3264(local_580);
        auVar220 = ZEXT3264(local_560);
        auVar219 = ZEXT3264(local_540);
        auVar218 = ZEXT3264(local_520);
        if (bVar96 != 0) {
          auVar112 = vsubps_avx(auVar108,auVar107);
          auVar102 = vfmadd213ps_fma(auVar112,local_5a0,auVar107);
          uVar3 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
          auVar27._4_4_ = uVar3;
          auVar27._0_4_ = uVar3;
          auVar27._8_4_ = uVar3;
          auVar27._12_4_ = uVar3;
          auVar27._16_4_ = uVar3;
          auVar27._20_4_ = uVar3;
          auVar27._24_4_ = uVar3;
          auVar27._28_4_ = uVar3;
          auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                        CONCAT48(auVar102._8_4_ + auVar102._8_4_,
                                                                 CONCAT44(auVar102._4_4_ +
                                                                          auVar102._4_4_,
                                                                          auVar102._0_4_ +
                                                                          auVar102._0_4_)))),auVar27
                                    );
          uVar23 = vcmpps_avx512vl(local_5c0,auVar112,6);
          bVar96 = bVar96 & (byte)uVar23;
          if (bVar96 != 0) {
            auVar161._8_4_ = 0xbf800000;
            auVar161._0_8_ = 0xbf800000bf800000;
            auVar161._12_4_ = 0xbf800000;
            auVar161._16_4_ = 0xbf800000;
            auVar161._20_4_ = 0xbf800000;
            auVar161._24_4_ = 0xbf800000;
            auVar161._28_4_ = 0xbf800000;
            auVar28._8_4_ = 0x40000000;
            auVar28._0_8_ = 0x4000000040000000;
            auVar28._12_4_ = 0x40000000;
            auVar28._16_4_ = 0x40000000;
            auVar28._20_4_ = 0x40000000;
            auVar28._24_4_ = 0x40000000;
            auVar28._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_1c0,auVar161,auVar28);
            local_1c0 = local_3a0;
            auVar112 = local_1c0;
            local_360 = 0;
            local_350 = local_6a0._0_8_;
            uStack_348 = local_6a0._8_8_;
            local_340 = local_610._0_8_;
            uStack_338 = local_610._8_8_;
            local_330 = local_630._0_8_;
            uStack_328 = local_630._8_8_;
            local_320 = local_620;
            uStack_318 = uStack_618;
            local_1c0 = auVar112;
            if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar185 = 1.0 / auVar203._0_4_;
              local_300[0] = fVar185 * (local_5a0._0_4_ + 0.0);
              local_300[1] = fVar185 * (local_5a0._4_4_ + 1.0);
              local_300[2] = fVar185 * (local_5a0._8_4_ + 2.0);
              local_300[3] = fVar185 * (local_5a0._12_4_ + 3.0);
              fStack_2f0 = fVar185 * (local_5a0._16_4_ + 4.0);
              fStack_2ec = fVar185 * (local_5a0._20_4_ + 5.0);
              fStack_2e8 = fVar185 * (local_5a0._24_4_ + 6.0);
              fStack_2e4 = local_5a0._28_4_ + 7.0;
              local_1c0._0_8_ = local_3a0._0_8_;
              local_1c0._8_8_ = local_3a0._8_8_;
              local_1c0._16_8_ = local_3a0._16_8_;
              local_1c0._24_8_ = local_3a0._24_8_;
              local_2e0 = local_1c0._0_8_;
              uStack_2d8 = local_1c0._8_8_;
              uStack_2d0 = local_1c0._16_8_;
              uStack_2c8 = local_1c0._24_8_;
              local_2c0 = local_5c0;
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar112 = vblendmps_avx512vl(auVar162,local_5c0);
              auVar133._0_4_ =
                   (uint)(bVar96 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar96 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 1 & 1);
              auVar133._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 2 & 1);
              auVar133._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 3 & 1);
              auVar133._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 4 & 1);
              auVar133._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 5 & 1);
              auVar133._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar96 >> 6 & 1);
              auVar133._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar133._28_4_ =
                   (uint)(bVar96 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
              auVar112 = vshufps_avx(auVar133,auVar133,0xb1);
              auVar112 = vminps_avx(auVar133,auVar112);
              auVar110 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar110);
              auVar110 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar110);
              uVar23 = vcmpps_avx512vl(auVar133,auVar112,0);
              bVar84 = (byte)uVar23 & bVar96;
              bVar85 = bVar96;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              uVar91 = 0;
              for (uVar88 = (uint)bVar85; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                uVar91 = uVar91 + 1;
              }
              uVar86 = (ulong)uVar91;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar185 = local_300[uVar86];
                uVar3 = *(undefined4 *)((long)&local_2e0 + uVar86 * 4);
                fVar190 = 1.0 - fVar185;
                fVar154 = fVar190 * fVar190 * -3.0;
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),
                                           ZEXT416((uint)(fVar185 * fVar190)),ZEXT416(0xc0000000));
                auVar100 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar190)),
                                           ZEXT416((uint)(fVar185 * fVar185)),ZEXT416(0x40000000));
                fVar190 = auVar102._0_4_ * 3.0;
                fVar191 = auVar100._0_4_ * 3.0;
                fVar175 = fVar185 * fVar185 * 3.0;
                auVar192._0_4_ = fVar175 * (float)local_620._0_4_;
                auVar192._4_4_ = fVar175 * (float)local_620._4_4_;
                auVar192._8_4_ = fVar175 * (float)uStack_618;
                auVar192._12_4_ = fVar175 * uStack_618._4_4_;
                auVar170._4_4_ = fVar191;
                auVar170._0_4_ = fVar191;
                auVar170._8_4_ = fVar191;
                auVar170._12_4_ = fVar191;
                auVar102 = vfmadd132ps_fma(auVar170,auVar192,local_630);
                auVar176._4_4_ = fVar190;
                auVar176._0_4_ = fVar190;
                auVar176._8_4_ = fVar190;
                auVar176._12_4_ = fVar190;
                auVar102 = vfmadd132ps_fma(auVar176,auVar102,local_610);
                auVar171._4_4_ = fVar154;
                auVar171._0_4_ = fVar154;
                auVar171._8_4_ = fVar154;
                auVar171._12_4_ = fVar154;
                auVar102 = vfmadd132ps_fma(auVar171,auVar102,local_6a0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar86 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar102._0_4_;
                uVar14 = vextractps_avx(auVar102,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                uVar14 = vextractps_avx(auVar102,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                *(float *)(ray + k * 4 + 0xf0) = fVar185;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                *(uint *)(ray + k * 4 + 0x110) = uVar12;
                *(uint *)(ray + k * 4 + 0x120) = uVar95;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_650 = vpbroadcastd_avx512vl();
                local_4d0 = vpbroadcastd_avx512vl();
                local_4e0 = local_610._0_8_;
                uStack_4d8 = local_610._8_8_;
                local_4f0 = local_630._0_8_;
                uStack_4e8 = local_630._8_8_;
                local_500 = local_620;
                uStack_4f8 = uStack_618;
                local_4a0 = uVar155;
                local_3c0 = local_5a0;
                local_380 = local_5c0;
                local_35c = iVar13;
                local_310 = bVar96;
                do {
                  auVar213 = auVar214._0_16_;
                  local_4c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_260 = local_300[uVar86];
                  local_250 = *(undefined4 *)((long)&local_2e0 + uVar86 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar86 * 4);
                  local_688.context = context->user;
                  fVar154 = 1.0 - local_260;
                  fVar185 = fVar154 * fVar154 * -3.0;
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                             ZEXT416((uint)(local_260 * fVar154)),
                                             ZEXT416(0xc0000000));
                  auVar100 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar154)),
                                             ZEXT416((uint)(local_260 * local_260)),
                                             ZEXT416(0x40000000));
                  fVar154 = auVar102._0_4_ * 3.0;
                  fVar190 = auVar100._0_4_ * 3.0;
                  fVar191 = local_260 * local_260 * 3.0;
                  auVar195._0_4_ = fVar191 * (float)local_500;
                  auVar195._4_4_ = fVar191 * local_500._4_4_;
                  auVar195._8_4_ = fVar191 * (float)uStack_4f8;
                  auVar195._12_4_ = fVar191 * uStack_4f8._4_4_;
                  auVar158._4_4_ = fVar190;
                  auVar158._0_4_ = fVar190;
                  auVar158._8_4_ = fVar190;
                  auVar158._12_4_ = fVar190;
                  auVar79._8_8_ = uStack_4e8;
                  auVar79._0_8_ = local_4f0;
                  auVar102 = vfmadd132ps_fma(auVar158,auVar195,auVar79);
                  auVar179._4_4_ = fVar154;
                  auVar179._0_4_ = fVar154;
                  auVar179._8_4_ = fVar154;
                  auVar179._12_4_ = fVar154;
                  auVar81._8_8_ = uStack_4d8;
                  auVar81._0_8_ = local_4e0;
                  auVar102 = vfmadd132ps_fma(auVar179,auVar102,auVar81);
                  auVar159._4_4_ = fVar185;
                  auVar159._0_4_ = fVar185;
                  auVar159._8_4_ = fVar185;
                  auVar159._12_4_ = fVar185;
                  auVar102 = vfmadd132ps_fma(auVar159,auVar102,local_6a0);
                  local_290 = auVar102._0_4_;
                  local_280 = vshufps_avx(auVar102,auVar102,0x55);
                  local_270 = vshufps_avx(auVar102,auVar102,0xaa);
                  iStack_28c = local_290;
                  iStack_288 = local_290;
                  iStack_284 = local_290;
                  fStack_25c = local_260;
                  fStack_258 = local_260;
                  fStack_254 = local_260;
                  uStack_24c = local_250;
                  uStack_248 = local_250;
                  uStack_244 = local_250;
                  local_240 = local_4d0._0_8_;
                  uStack_238 = local_4d0._8_8_;
                  local_230 = local_650;
                  vpcmpeqd_avx2(ZEXT1632(local_650),ZEXT1632(local_650));
                  uStack_21c = (local_688.context)->instID[0];
                  local_220 = uStack_21c;
                  uStack_218 = uStack_21c;
                  uStack_214 = uStack_21c;
                  uStack_210 = (local_688.context)->instPrimID[0];
                  uStack_20c = uStack_210;
                  uStack_208 = uStack_210;
                  uStack_204 = uStack_210;
                  local_6c0 = local_3f0._0_8_;
                  uStack_6b8 = local_3f0._8_8_;
                  local_688.valid = (int *)&local_6c0;
                  local_688.geometryUserPtr = pGVar94->userPtr;
                  local_688.hit = (RTCHitN *)&local_290;
                  local_688.N = 4;
                  local_640._0_8_ = uVar86;
                  local_688.ray = (RTCRayN *)ray;
                  if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar94->intersectionFilterN)(&local_688);
                    auVar221 = ZEXT3264(local_580);
                    auVar220 = ZEXT3264(local_560);
                    auVar219 = ZEXT3264(local_540);
                    auVar218 = ZEXT3264(local_520);
                    auVar222 = ZEXT3264(local_480);
                    auVar217 = ZEXT3264(local_460);
                    auVar216 = ZEXT3264(local_440);
                    auVar215 = ZEXT3264(local_420);
                    auVar102 = vxorps_avx512vl(auVar213,auVar213);
                    auVar214 = ZEXT1664(auVar102);
                    uVar86 = local_640._0_8_;
                    uVar155 = local_4a0;
                  }
                  auVar102 = auVar214._0_16_;
                  auVar76._8_8_ = uStack_6b8;
                  auVar76._0_8_ = local_6c0;
                  uVar97 = vptestmd_avx512vl(auVar76,auVar76);
                  if ((uVar97 & 0xf) == 0) {
LAB_01d89a27:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0._0_4_;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_688);
                      auVar221 = ZEXT3264(local_580);
                      auVar220 = ZEXT3264(local_560);
                      auVar219 = ZEXT3264(local_540);
                      auVar218 = ZEXT3264(local_520);
                      auVar222 = ZEXT3264(local_480);
                      auVar217 = ZEXT3264(local_460);
                      auVar216 = ZEXT3264(local_440);
                      auVar215 = ZEXT3264(local_420);
                      auVar102 = vxorps_avx512vl(auVar102,auVar102);
                      auVar214 = ZEXT1664(auVar102);
                      uVar86 = local_640._0_8_;
                      uVar155 = local_4a0;
                    }
                    auVar77._8_8_ = uStack_6b8;
                    auVar77._0_8_ = local_6c0;
                    uVar97 = vptestmd_avx512vl(auVar77,auVar77);
                    uVar97 = uVar97 & 0xf;
                    bVar85 = (byte)uVar97;
                    if (bVar85 == 0) goto LAB_01d89a27;
                    iVar1 = *(int *)(local_688.hit + 4);
                    iVar2 = *(int *)(local_688.hit + 8);
                    iVar73 = *(int *)(local_688.hit + 0xc);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_688.ray + 0xc0) =
                         (uint)(bVar85 & 1) * *(int *)local_688.hit |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xc0);
                    *(uint *)(local_688.ray + 0xc4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xc4);
                    *(uint *)(local_688.ray + 200) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 200);
                    *(uint *)(local_688.ray + 0xcc) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xcc);
                    iVar1 = *(int *)(local_688.hit + 0x14);
                    iVar2 = *(int *)(local_688.hit + 0x18);
                    iVar73 = *(int *)(local_688.hit + 0x1c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_688.ray + 0xd0) =
                         (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x10) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xd0);
                    *(uint *)(local_688.ray + 0xd4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xd4);
                    *(uint *)(local_688.ray + 0xd8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xd8);
                    *(uint *)(local_688.ray + 0xdc) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xdc);
                    iVar1 = *(int *)(local_688.hit + 0x24);
                    iVar2 = *(int *)(local_688.hit + 0x28);
                    iVar73 = *(int *)(local_688.hit + 0x2c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_688.ray + 0xe0) =
                         (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x20) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xe0);
                    *(uint *)(local_688.ray + 0xe4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xe4);
                    *(uint *)(local_688.ray + 0xe8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xe8);
                    *(uint *)(local_688.ray + 0xec) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xec);
                    iVar1 = *(int *)(local_688.hit + 0x34);
                    iVar2 = *(int *)(local_688.hit + 0x38);
                    iVar73 = *(int *)(local_688.hit + 0x3c);
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                    bVar18 = SUB81(uVar97 >> 3,0);
                    *(uint *)(local_688.ray + 0xf0) =
                         (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x30) |
                         (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xf0);
                    *(uint *)(local_688.ray + 0xf4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xf4);
                    *(uint *)(local_688.ray + 0xf8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xf8);
                    *(uint *)(local_688.ray + 0xfc) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xfc);
                    auVar102 = *(undefined1 (*) [16])(local_688.ray + 0x100);
                    auVar106._0_4_ =
                         (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x40) |
                         (uint)!(bool)(bVar85 & 1) * auVar102._0_4_;
                    bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                    auVar106._4_4_ =
                         (uint)bVar16 * *(int *)(local_688.hit + 0x44) |
                         (uint)!bVar16 * auVar102._4_4_;
                    bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
                    auVar106._8_4_ =
                         (uint)bVar16 * *(int *)(local_688.hit + 0x48) |
                         (uint)!bVar16 * auVar102._8_4_;
                    bVar16 = SUB81(uVar97 >> 3,0);
                    auVar106._12_4_ =
                         (uint)bVar16 * *(int *)(local_688.hit + 0x4c) |
                         (uint)!bVar16 * auVar102._12_4_;
                    *(undefined1 (*) [16])(local_688.ray + 0x100) = auVar106;
                    auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x50));
                    *(undefined1 (*) [16])(local_688.ray + 0x110) = auVar102;
                    auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x60));
                    *(undefined1 (*) [16])(local_688.ray + 0x120) = auVar102;
                    auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x70));
                    *(undefined1 (*) [16])(local_688.ray + 0x130) = auVar102;
                    auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x80));
                    *(undefined1 (*) [16])(local_688.ray + 0x140) = auVar102;
                  }
                  bVar85 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar96;
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar35._4_4_ = uVar3;
                  auVar35._0_4_ = uVar3;
                  auVar35._8_4_ = uVar3;
                  auVar35._12_4_ = uVar3;
                  auVar35._16_4_ = uVar3;
                  auVar35._20_4_ = uVar3;
                  auVar35._24_4_ = uVar3;
                  auVar35._28_4_ = uVar3;
                  uVar23 = vcmpps_avx512vl(local_5c0,auVar35,2);
                  bVar96 = bVar85 & (byte)uVar23;
                  if ((bVar85 & (byte)uVar23) != 0) {
                    auVar166._8_4_ = 0x7f800000;
                    auVar166._0_8_ = 0x7f8000007f800000;
                    auVar166._12_4_ = 0x7f800000;
                    auVar166._16_4_ = 0x7f800000;
                    auVar166._20_4_ = 0x7f800000;
                    auVar166._24_4_ = 0x7f800000;
                    auVar166._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar166,local_5c0);
                    auVar147._0_4_ =
                         (uint)(bVar96 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar96 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 1 & 1);
                    auVar147._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 2 & 1);
                    auVar147._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 3 & 1);
                    auVar147._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 4 & 1);
                    auVar147._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 5 & 1);
                    auVar147._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar96 >> 6 & 1);
                    auVar147._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar147._28_4_ =
                         (uint)(bVar96 >> 7) * auVar112._28_4_ |
                         (uint)!(bool)(bVar96 >> 7) * 0x7f800000;
                    auVar112 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar112 = vminps_avx(auVar147,auVar112);
                    auVar110 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar110);
                    auVar110 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar110);
                    uVar23 = vcmpps_avx512vl(auVar147,auVar112,0);
                    bVar84 = (byte)uVar23 & bVar96;
                    bVar85 = bVar96;
                    if (bVar84 != 0) {
                      bVar85 = bVar84;
                    }
                    uVar91 = 0;
                    for (uVar88 = (uint)bVar85; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000
                        ) {
                      uVar91 = uVar91 + 1;
                    }
                    uVar86 = (ulong)uVar91;
                  }
                } while (bVar96 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        auVar112 = vpbroadcastd_avx512vl();
        auVar223 = ZEXT3264(auVar112);
        local_4a0 = local_1e0;
        uStack_49c = local_1e0;
        uStack_498 = local_1e0;
        uStack_494 = local_1e0;
        uStack_490 = local_1e0;
        uStack_48c = local_1e0;
        uStack_488 = local_1e0;
        uStack_484 = local_1e0;
        local_1e0 = uVar155;
        uStack_1dc = uVar155;
        uStack_1d8 = uVar155;
        uStack_1d4 = uVar155;
        uStack_1d0 = uVar155;
        uStack_1cc = uVar155;
        uStack_1c8 = uVar155;
        uStack_1c4 = uVar155;
        fStack_3d0 = 1.0 / (float)local_3e0._0_4_;
        local_3e0._4_4_ = fStack_3d0;
        local_3e0._0_4_ = fStack_3d0;
        fStack_3d8 = fStack_3d0;
        fStack_3d4 = fStack_3d0;
        local_640 = vpbroadcastd_avx512vl();
        local_4c0 = vpbroadcastd_avx512vl();
        lVar92 = 8;
        fStack_3cc = fStack_3d0;
        fStack_3c8 = fStack_3d0;
        fStack_3c4 = fStack_3d0;
        do {
          auVar112 = vpbroadcastd_avx512vl();
          auVar113 = vpor_avx2(auVar112,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar223._0_32_,auVar113);
          auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar92 * 4 + lVar72);
          auVar110 = *(undefined1 (*) [32])(lVar72 + 0x2227768 + lVar92 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar72 + 0x2227bec + lVar92 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar72 + 0x2228070 + lVar92 * 4);
          local_560 = auVar220._0_32_;
          auVar111 = vmulps_avx512vl(local_560,auVar122);
          local_580 = auVar221._0_32_;
          auVar121 = vmulps_avx512vl(local_580,auVar122);
          auVar53._4_4_ = auVar122._4_4_ * (float)local_e0._4_4_;
          auVar53._0_4_ = auVar122._0_4_ * (float)local_e0._0_4_;
          auVar53._8_4_ = auVar122._8_4_ * fStack_d8;
          auVar53._12_4_ = auVar122._12_4_ * fStack_d4;
          auVar53._16_4_ = auVar122._16_4_ * fStack_d0;
          auVar53._20_4_ = auVar122._20_4_ * fStack_cc;
          auVar53._24_4_ = auVar122._24_4_ * fStack_c8;
          auVar53._28_4_ = auVar113._28_4_;
          local_520 = auVar218._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar111,auVar123,local_520);
          local_540 = auVar219._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar121,auVar123,local_540);
          auVar102 = vfmadd231ps_fma(auVar53,auVar123,local_c0);
          auVar200 = auVar217._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar200);
          auVar208 = auVar222._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar208);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar110,local_a0);
          auVar196 = auVar215._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar196);
          auVar197 = auVar216._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar111,auVar112,auVar197);
          auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar92 * 4 + lVar72);
          auVar111 = *(undefined1 (*) [32])(lVar72 + 0x2229b88 + lVar92 * 4);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar112,local_100);
          auVar121 = *(undefined1 (*) [32])(lVar72 + 0x222a00c + lVar92 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar72 + 0x222a490 + lVar92 * 4);
          auVar115 = vmulps_avx512vl(local_560,auVar114);
          auVar116 = vmulps_avx512vl(local_580,auVar114);
          auVar54._4_4_ = auVar114._4_4_ * (float)local_e0._4_4_;
          auVar54._0_4_ = auVar114._0_4_ * (float)local_e0._0_4_;
          auVar54._8_4_ = auVar114._8_4_ * fStack_d8;
          auVar54._12_4_ = auVar114._12_4_ * fStack_d4;
          auVar54._16_4_ = auVar114._16_4_ * fStack_d0;
          auVar54._20_4_ = auVar114._20_4_ * fStack_cc;
          auVar54._24_4_ = auVar114._24_4_ * fStack_c8;
          auVar54._28_4_ = uStack_c4;
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar121,local_520);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar121,local_540);
          auVar102 = vfmadd231ps_fma(auVar54,auVar121,local_c0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar200);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,auVar208);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar111,local_a0);
          auVar107 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar196);
          auVar108 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar197);
          auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar113,local_100);
          auVar120 = vmaxps_avx512vl(auVar118,auVar119);
          auVar115 = vsubps_avx(auVar107,auVar109);
          auVar116 = vsubps_avx(auVar108,auVar117);
          auVar134 = vmulps_avx512vl(auVar117,auVar115);
          in_ZMM23 = ZEXT3264(auVar208);
          auVar135 = vmulps_avx512vl(auVar109,auVar116);
          auVar134 = vsubps_avx512vl(auVar134,auVar135);
          auVar135 = vmulps_avx512vl(auVar116,auVar116);
          auVar135 = vfmadd231ps_avx512vl(auVar135,auVar115,auVar115);
          auVar120 = vmulps_avx512vl(auVar120,auVar120);
          auVar120 = vmulps_avx512vl(auVar120,auVar135);
          auVar134 = vmulps_avx512vl(auVar134,auVar134);
          uVar23 = vcmpps_avx512vl(auVar134,auVar120,2);
          local_310 = (byte)uVar24 & (byte)uVar23;
          if (local_310 == 0) {
            auVar222 = ZEXT3264(auVar208);
          }
          else {
            auVar114 = vmulps_avx512vl(local_140,auVar114);
            auVar121 = vfmadd213ps_avx512vl(auVar121,local_120,auVar114);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_180,auVar121);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar111);
            auVar122 = vmulps_avx512vl(local_140,auVar122);
            auVar123 = vfmadd213ps_avx512vl(auVar123,local_120,auVar122);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_180,auVar123);
            auVar111 = vfmadd213ps_avx512vl(auVar112,local_160,auVar110);
            auVar112 = *(undefined1 (*) [32])(lVar72 + 0x22284f4 + lVar92 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar72 + 0x2228978 + lVar92 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar72 + 0x2228dfc + lVar92 * 4);
            auVar122 = *(undefined1 (*) [32])(lVar72 + 0x2229280 + lVar92 * 4);
            auVar121 = vmulps_avx512vl(local_560,auVar122);
            auVar114 = vmulps_avx512vl(local_580,auVar122);
            auVar122 = vmulps_avx512vl(local_140,auVar122);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar123,local_520);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_540);
            auVar123 = vfmadd231ps_avx512vl(auVar122,local_120,auVar123);
            auVar122 = vfmadd231ps_avx512vl(auVar121,auVar110,auVar200);
            auVar121 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar208);
            auVar110 = vfmadd231ps_avx512vl(auVar123,local_180,auVar110);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar112,auVar196);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar112,auVar197);
            auVar114 = vfmadd231ps_avx512vl(auVar110,local_160,auVar112);
            auVar112 = *(undefined1 (*) [32])(lVar72 + 0x222a914 + lVar92 * 4);
            auVar110 = *(undefined1 (*) [32])(lVar72 + 0x222b21c + lVar92 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar72 + 0x222b6a0 + lVar92 * 4);
            auVar120 = vmulps_avx512vl(local_560,auVar123);
            auVar134 = vmulps_avx512vl(local_580,auVar123);
            auVar123 = vmulps_avx512vl(local_140,auVar123);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar110,local_520);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar110,local_540);
            auVar123 = vfmadd231ps_avx512vl(auVar123,local_120,auVar110);
            auVar110 = *(undefined1 (*) [32])(lVar72 + 0x222ad98 + lVar92 * 4);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar110,auVar200);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar110,auVar208);
            auVar110 = vfmadd231ps_avx512vl(auVar123,local_180,auVar110);
            auVar123 = vfmadd231ps_avx512vl(auVar120,auVar112,auVar196);
            auVar120 = vfmadd231ps_avx512vl(auVar134,auVar112,auVar197);
            auVar110 = vfmadd231ps_avx512vl(auVar110,local_160,auVar112);
            auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar122,auVar134);
            vandps_avx512vl(auVar121,auVar134);
            auVar112 = vmaxps_avx(auVar134,auVar134);
            vandps_avx512vl(auVar114,auVar134);
            auVar112 = vmaxps_avx(auVar112,auVar134);
            auVar82._4_4_ = uStack_49c;
            auVar82._0_4_ = local_4a0;
            auVar82._8_4_ = uStack_498;
            auVar82._12_4_ = uStack_494;
            auVar82._16_4_ = uStack_490;
            auVar82._20_4_ = uStack_48c;
            auVar82._24_4_ = uStack_488;
            auVar82._28_4_ = uStack_484;
            uVar86 = vcmpps_avx512vl(auVar112,auVar82,1);
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar136._0_4_ = (float)((uint)bVar16 * auVar115._0_4_ | (uint)!bVar16 * auVar122._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * auVar122._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * auVar122._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * auVar122._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar16 * auVar115._16_4_ | (uint)!bVar16 * auVar122._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar16 * auVar115._20_4_ | (uint)!bVar16 * auVar122._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar16 * auVar115._24_4_ | (uint)!bVar16 * auVar122._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar136._28_4_ = (uint)bVar16 * auVar115._28_4_ | (uint)!bVar16 * auVar122._28_4_;
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar137._0_4_ = (float)((uint)bVar16 * auVar116._0_4_ | (uint)!bVar16 * auVar121._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar121._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar121._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar121._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar137._16_4_ =
                 (float)((uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * auVar121._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar137._20_4_ =
                 (float)((uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * auVar121._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar137._24_4_ =
                 (float)((uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * auVar121._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar137._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar121._28_4_;
            vandps_avx512vl(auVar123,auVar134);
            vandps_avx512vl(auVar120,auVar134);
            auVar112 = vmaxps_avx(auVar137,auVar137);
            vandps_avx512vl(auVar110,auVar134);
            auVar112 = vmaxps_avx(auVar112,auVar137);
            uVar86 = vcmpps_avx512vl(auVar112,auVar82,1);
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar138._0_4_ = (uint)bVar16 * auVar115._0_4_ | (uint)!bVar16 * auVar123._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * auVar123._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * auVar123._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * auVar123._12_4_;
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar138._16_4_ = (uint)bVar16 * auVar115._16_4_ | (uint)!bVar16 * auVar123._16_4_;
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar138._20_4_ = (uint)bVar16 * auVar115._20_4_ | (uint)!bVar16 * auVar123._20_4_;
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar138._24_4_ = (uint)bVar16 * auVar115._24_4_ | (uint)!bVar16 * auVar123._24_4_;
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar138._28_4_ = (uint)bVar16 * auVar115._28_4_ | (uint)!bVar16 * auVar123._28_4_;
            bVar16 = (bool)((byte)uVar86 & 1);
            auVar139._0_4_ = (float)((uint)bVar16 * auVar116._0_4_ | (uint)!bVar16 * auVar120._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar120._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar120._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar120._12_4_);
            bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * auVar120._16_4_);
            bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * auVar120._20_4_);
            bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * auVar120._24_4_);
            bVar16 = SUB81(uVar86 >> 7,0);
            auVar139._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar120._28_4_;
            auVar204._8_4_ = 0x80000000;
            auVar204._0_8_ = 0x8000000080000000;
            auVar204._12_4_ = 0x80000000;
            auVar204._16_4_ = 0x80000000;
            auVar204._20_4_ = 0x80000000;
            auVar204._24_4_ = 0x80000000;
            auVar204._28_4_ = 0x80000000;
            auVar112 = vxorps_avx512vl(auVar138,auVar204);
            auVar120 = auVar214._0_32_;
            auVar110 = vfmadd213ps_avx512vl(auVar136,auVar136,auVar120);
            auVar102 = vfmadd231ps_fma(auVar110,auVar137,auVar137);
            auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
            auVar212._8_4_ = 0xbf000000;
            auVar212._0_8_ = 0xbf000000bf000000;
            auVar212._12_4_ = 0xbf000000;
            auVar212._16_4_ = 0xbf000000;
            auVar212._20_4_ = 0xbf000000;
            auVar212._24_4_ = 0xbf000000;
            auVar212._28_4_ = 0xbf000000;
            fVar185 = auVar110._0_4_;
            fVar154 = auVar110._4_4_;
            fVar190 = auVar110._8_4_;
            fVar191 = auVar110._12_4_;
            fVar175 = auVar110._16_4_;
            fVar182 = auVar110._20_4_;
            fVar183 = auVar110._24_4_;
            auVar55._4_4_ = fVar154 * fVar154 * fVar154 * auVar102._4_4_ * -0.5;
            auVar55._0_4_ = fVar185 * fVar185 * fVar185 * auVar102._0_4_ * -0.5;
            auVar55._8_4_ = fVar190 * fVar190 * fVar190 * auVar102._8_4_ * -0.5;
            auVar55._12_4_ = fVar191 * fVar191 * fVar191 * auVar102._12_4_ * -0.5;
            auVar55._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar55._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar55._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar55._28_4_ = auVar137._28_4_;
            auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar110 = vfmadd231ps_avx512vl(auVar55,auVar123,auVar110);
            auVar56._4_4_ = auVar137._4_4_ * auVar110._4_4_;
            auVar56._0_4_ = auVar137._0_4_ * auVar110._0_4_;
            auVar56._8_4_ = auVar137._8_4_ * auVar110._8_4_;
            auVar56._12_4_ = auVar137._12_4_ * auVar110._12_4_;
            auVar56._16_4_ = auVar137._16_4_ * auVar110._16_4_;
            auVar56._20_4_ = auVar137._20_4_ * auVar110._20_4_;
            auVar56._24_4_ = auVar137._24_4_ * auVar110._24_4_;
            auVar56._28_4_ = 0;
            auVar57._4_4_ = auVar110._4_4_ * -auVar136._4_4_;
            auVar57._0_4_ = auVar110._0_4_ * -auVar136._0_4_;
            auVar57._8_4_ = auVar110._8_4_ * -auVar136._8_4_;
            auVar57._12_4_ = auVar110._12_4_ * -auVar136._12_4_;
            auVar57._16_4_ = auVar110._16_4_ * -auVar136._16_4_;
            auVar57._20_4_ = auVar110._20_4_ * -auVar136._20_4_;
            auVar57._24_4_ = auVar110._24_4_ * -auVar136._24_4_;
            auVar57._28_4_ = auVar137._28_4_;
            auVar122 = vmulps_avx512vl(auVar110,auVar120);
            auVar110 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar120);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar139,auVar139);
            auVar121 = vrsqrt14ps_avx512vl(auVar110);
            auVar110 = vmulps_avx512vl(auVar110,auVar212);
            fVar185 = auVar121._0_4_;
            fVar154 = auVar121._4_4_;
            fVar190 = auVar121._8_4_;
            fVar191 = auVar121._12_4_;
            fVar175 = auVar121._16_4_;
            fVar182 = auVar121._20_4_;
            fVar183 = auVar121._24_4_;
            auVar58._4_4_ = fVar154 * fVar154 * fVar154 * auVar110._4_4_;
            auVar58._0_4_ = fVar185 * fVar185 * fVar185 * auVar110._0_4_;
            auVar58._8_4_ = fVar190 * fVar190 * fVar190 * auVar110._8_4_;
            auVar58._12_4_ = fVar191 * fVar191 * fVar191 * auVar110._12_4_;
            auVar58._16_4_ = fVar175 * fVar175 * fVar175 * auVar110._16_4_;
            auVar58._20_4_ = fVar182 * fVar182 * fVar182 * auVar110._20_4_;
            auVar58._24_4_ = fVar183 * fVar183 * fVar183 * auVar110._24_4_;
            auVar58._28_4_ = auVar110._28_4_;
            auVar110 = vfmadd231ps_avx512vl(auVar58,auVar123,auVar121);
            auVar59._4_4_ = auVar139._4_4_ * auVar110._4_4_;
            auVar59._0_4_ = auVar139._0_4_ * auVar110._0_4_;
            auVar59._8_4_ = auVar139._8_4_ * auVar110._8_4_;
            auVar59._12_4_ = auVar139._12_4_ * auVar110._12_4_;
            auVar59._16_4_ = auVar139._16_4_ * auVar110._16_4_;
            auVar59._20_4_ = auVar139._20_4_ * auVar110._20_4_;
            auVar59._24_4_ = auVar139._24_4_ * auVar110._24_4_;
            auVar59._28_4_ = auVar121._28_4_;
            auVar60._4_4_ = auVar110._4_4_ * auVar112._4_4_;
            auVar60._0_4_ = auVar110._0_4_ * auVar112._0_4_;
            auVar60._8_4_ = auVar110._8_4_ * auVar112._8_4_;
            auVar60._12_4_ = auVar110._12_4_ * auVar112._12_4_;
            auVar60._16_4_ = auVar110._16_4_ * auVar112._16_4_;
            auVar60._20_4_ = auVar110._20_4_ * auVar112._20_4_;
            auVar60._24_4_ = auVar110._24_4_ * auVar112._24_4_;
            auVar60._28_4_ = auVar112._28_4_;
            auVar112 = vmulps_avx512vl(auVar110,auVar120);
            auVar102 = vfmadd213ps_fma(auVar56,auVar118,auVar109);
            auVar100 = vfmadd213ps_fma(auVar57,auVar118,auVar117);
            auVar123 = vfmadd213ps_avx512vl(auVar122,auVar118,auVar111);
            auVar121 = vfmadd213ps_avx512vl(auVar59,auVar119,auVar107);
            auVar10 = vfnmadd213ps_fma(auVar56,auVar118,auVar109);
            auVar213 = vfmadd213ps_fma(auVar60,auVar119,auVar108);
            auVar101 = vfnmadd213ps_fma(auVar57,auVar118,auVar117);
            auVar6 = vfmadd213ps_fma(auVar112,auVar119,auVar113);
            auVar168 = vfnmadd231ps_fma(auVar111,auVar118,auVar122);
            auVar103 = vfnmadd213ps_fma(auVar59,auVar119,auVar107);
            auVar167 = vfnmadd213ps_fma(auVar60,auVar119,auVar108);
            auVar169 = vfnmadd231ps_fma(auVar113,auVar119,auVar112);
            auVar113 = vsubps_avx512vl(auVar121,ZEXT1632(auVar10));
            auVar112 = vsubps_avx(ZEXT1632(auVar213),ZEXT1632(auVar101));
            auVar110 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar168));
            auVar61._4_4_ = auVar112._4_4_ * auVar168._4_4_;
            auVar61._0_4_ = auVar112._0_4_ * auVar168._0_4_;
            auVar61._8_4_ = auVar112._8_4_ * auVar168._8_4_;
            auVar61._12_4_ = auVar112._12_4_ * auVar168._12_4_;
            auVar61._16_4_ = auVar112._16_4_ * 0.0;
            auVar61._20_4_ = auVar112._20_4_ * 0.0;
            auVar61._24_4_ = auVar112._24_4_ * 0.0;
            auVar61._28_4_ = auVar122._28_4_;
            auVar7 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar101),auVar110);
            auVar62._4_4_ = auVar110._4_4_ * auVar10._4_4_;
            auVar62._0_4_ = auVar110._0_4_ * auVar10._0_4_;
            auVar62._8_4_ = auVar110._8_4_ * auVar10._8_4_;
            auVar62._12_4_ = auVar110._12_4_ * auVar10._12_4_;
            auVar62._16_4_ = auVar110._16_4_ * 0.0;
            auVar62._20_4_ = auVar110._20_4_ * 0.0;
            auVar62._24_4_ = auVar110._24_4_ * 0.0;
            auVar62._28_4_ = auVar110._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar168),auVar113);
            auVar63._4_4_ = auVar101._4_4_ * auVar113._4_4_;
            auVar63._0_4_ = auVar101._0_4_ * auVar113._0_4_;
            auVar63._8_4_ = auVar101._8_4_ * auVar113._8_4_;
            auVar63._12_4_ = auVar101._12_4_ * auVar113._12_4_;
            auVar63._16_4_ = auVar113._16_4_ * 0.0;
            auVar63._20_4_ = auVar113._20_4_ * 0.0;
            auVar63._24_4_ = auVar113._24_4_ * 0.0;
            auVar63._28_4_ = auVar113._28_4_;
            auVar9 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar10),auVar112);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar120,ZEXT1632(auVar8));
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar120,ZEXT1632(auVar7));
            uVar86 = vcmpps_avx512vl(auVar112,auVar120,2);
            bVar96 = (byte)uVar86;
            fVar98 = (float)((uint)(bVar96 & 1) * auVar102._0_4_ |
                            (uint)!(bool)(bVar96 & 1) * auVar103._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar148 = (float)((uint)bVar16 * auVar102._4_4_ | (uint)!bVar16 * auVar103._4_4_);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar150 = (float)((uint)bVar16 * auVar102._8_4_ | (uint)!bVar16 * auVar103._8_4_);
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar152 = (float)((uint)bVar16 * auVar102._12_4_ | (uint)!bVar16 * auVar103._12_4_);
            auVar114 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar150,CONCAT44(fVar148,fVar98))));
            fVar99 = (float)((uint)(bVar96 & 1) * auVar100._0_4_ |
                            (uint)!(bool)(bVar96 & 1) * auVar167._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            fVar149 = (float)((uint)bVar16 * auVar100._4_4_ | (uint)!bVar16 * auVar167._4_4_);
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            fVar151 = (float)((uint)bVar16 * auVar100._8_4_ | (uint)!bVar16 * auVar167._8_4_);
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            fVar153 = (float)((uint)bVar16 * auVar100._12_4_ | (uint)!bVar16 * auVar167._12_4_);
            auVar115 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar151,CONCAT44(fVar149,fVar99))));
            auVar140._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar123._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar169._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar16 * auVar123._4_4_ | (uint)!bVar16 * auVar169._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar16 * auVar123._8_4_ | (uint)!bVar16 * auVar169._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar16 * auVar123._12_4_ | (uint)!bVar16 * auVar169._12_4_);
            fVar190 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar123._16_4_);
            auVar140._16_4_ = fVar190;
            fVar154 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar123._20_4_);
            auVar140._20_4_ = fVar154;
            fVar185 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar123._24_4_);
            auVar140._24_4_ = fVar185;
            iVar1 = (uint)(byte)(uVar86 >> 7) * auVar123._28_4_;
            auVar140._28_4_ = iVar1;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar121);
            auVar141._0_4_ =
                 (uint)(bVar96 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar96 & 1) * auVar7._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar7._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar7._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar7._12_4_;
            auVar141._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_;
            auVar141._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_;
            auVar141._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_;
            auVar141._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar213));
            auVar142._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar102._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar102._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar102._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar102._12_4_);
            fVar191 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_);
            auVar142._16_4_ = fVar191;
            fVar182 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_);
            auVar142._20_4_ = fVar182;
            fVar175 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_);
            auVar142._24_4_ = fVar175;
            auVar142._28_4_ = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
            auVar112 = vblendmps_avx512vl(ZEXT1632(auVar168),ZEXT1632(auVar6));
            auVar143._0_4_ =
                 (float)((uint)(bVar96 & 1) * auVar112._0_4_ |
                        (uint)!(bool)(bVar96 & 1) * auVar100._0_4_);
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar100._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar100._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar100._12_4_);
            fVar174 = (float)((uint)((byte)(uVar86 >> 4) & 1) * auVar112._16_4_);
            auVar143._16_4_ = fVar174;
            fVar184 = (float)((uint)((byte)(uVar86 >> 5) & 1) * auVar112._20_4_);
            auVar143._20_4_ = fVar184;
            fVar183 = (float)((uint)((byte)(uVar86 >> 6) & 1) * auVar112._24_4_);
            auVar143._24_4_ = fVar183;
            iVar2 = (uint)(byte)(uVar86 >> 7) * auVar112._28_4_;
            auVar143._28_4_ = iVar2;
            auVar144._0_4_ =
                 (uint)(bVar96 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar96 & 1) * auVar121._0_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar16 * (int)auVar10._4_4_ | (uint)!bVar16 * auVar121._4_4_;
            bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar16 * (int)auVar10._8_4_ | (uint)!bVar16 * auVar121._8_4_;
            bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar16 * (int)auVar10._12_4_ | (uint)!bVar16 * auVar121._12_4_;
            auVar144._16_4_ = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * auVar121._16_4_;
            auVar144._20_4_ = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * auVar121._20_4_;
            auVar144._24_4_ = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * auVar121._24_4_;
            auVar144._28_4_ = (uint)!SUB81(uVar86 >> 7,0) * auVar121._28_4_;
            bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar121 = vsubps_avx512vl(auVar144,auVar114);
            auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar101._12_4_ |
                                                     (uint)!bVar20 * auVar213._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar101._8_4_ |
                                                              (uint)!bVar18 * auVar213._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar101._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar213._4_4_,
                                                                       (uint)(bVar96 & 1) *
                                                                       (int)auVar101._0_4_ |
                                                                       (uint)!(bool)(bVar96 & 1) *
                                                                       auVar213._0_4_)))),auVar115);
            auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar168._12_4_ |
                                                     (uint)!bVar21 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar168._8_4_ |
                                                              (uint)!bVar19 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar168._4_4_ |
                                                                       (uint)!bVar17 * auVar6._4_4_,
                                                                       (uint)(bVar96 & 1) *
                                                                       (int)auVar168._0_4_ |
                                                                       (uint)!(bool)(bVar96 & 1) *
                                                                       auVar6._0_4_)))),auVar140);
            auVar122 = vsubps_avx(auVar114,auVar141);
            auVar113 = vsubps_avx(auVar115,auVar142);
            auVar111 = vsubps_avx(auVar140,auVar143);
            auVar64._4_4_ = auVar123._4_4_ * fVar148;
            auVar64._0_4_ = auVar123._0_4_ * fVar98;
            auVar64._8_4_ = auVar123._8_4_ * fVar150;
            auVar64._12_4_ = auVar123._12_4_ * fVar152;
            auVar64._16_4_ = auVar123._16_4_ * 0.0;
            auVar64._20_4_ = auVar123._20_4_ * 0.0;
            auVar64._24_4_ = auVar123._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar64,auVar140,auVar121);
            auVar181._0_4_ = fVar99 * auVar121._0_4_;
            auVar181._4_4_ = fVar149 * auVar121._4_4_;
            auVar181._8_4_ = fVar151 * auVar121._8_4_;
            auVar181._12_4_ = fVar153 * auVar121._12_4_;
            auVar181._16_4_ = auVar121._16_4_ * 0.0;
            auVar181._20_4_ = auVar121._20_4_ * 0.0;
            auVar181._24_4_ = auVar121._24_4_ * 0.0;
            auVar181._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar181,auVar114,auVar110);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar120,ZEXT1632(auVar102));
            auVar188._0_4_ = auVar110._0_4_ * auVar140._0_4_;
            auVar188._4_4_ = auVar110._4_4_ * auVar140._4_4_;
            auVar188._8_4_ = auVar110._8_4_ * auVar140._8_4_;
            auVar188._12_4_ = auVar110._12_4_ * auVar140._12_4_;
            auVar188._16_4_ = auVar110._16_4_ * fVar190;
            auVar188._20_4_ = auVar110._20_4_ * fVar154;
            auVar188._24_4_ = auVar110._24_4_ * fVar185;
            auVar188._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar188,auVar115,auVar123);
            auVar116 = vfmadd231ps_avx512vl(auVar112,auVar120,ZEXT1632(auVar102));
            auVar112 = vmulps_avx512vl(auVar111,auVar141);
            auVar112 = vfmsub231ps_avx512vl(auVar112,auVar122,auVar143);
            auVar65._4_4_ = auVar113._4_4_ * auVar143._4_4_;
            auVar65._0_4_ = auVar113._0_4_ * auVar143._0_4_;
            auVar65._8_4_ = auVar113._8_4_ * auVar143._8_4_;
            auVar65._12_4_ = auVar113._12_4_ * auVar143._12_4_;
            auVar65._16_4_ = auVar113._16_4_ * fVar174;
            auVar65._20_4_ = auVar113._20_4_ * fVar184;
            auVar65._24_4_ = auVar113._24_4_ * fVar183;
            auVar65._28_4_ = iVar2;
            auVar102 = vfmsub231ps_fma(auVar65,auVar142,auVar111);
            auVar189._0_4_ = auVar142._0_4_ * auVar122._0_4_;
            auVar189._4_4_ = auVar142._4_4_ * auVar122._4_4_;
            auVar189._8_4_ = auVar142._8_4_ * auVar122._8_4_;
            auVar189._12_4_ = auVar142._12_4_ * auVar122._12_4_;
            auVar189._16_4_ = fVar191 * auVar122._16_4_;
            auVar189._20_4_ = fVar182 * auVar122._20_4_;
            auVar189._24_4_ = fVar175 * auVar122._24_4_;
            auVar189._28_4_ = 0;
            auVar100 = vfmsub231ps_fma(auVar189,auVar113,auVar141);
            auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar120,auVar112);
            auVar109 = vfmadd231ps_avx512vl(auVar112,auVar120,ZEXT1632(auVar102));
            auVar112 = vmaxps_avx(auVar116,auVar109);
            uVar23 = vcmpps_avx512vl(auVar112,auVar120,2);
            local_310 = local_310 & (byte)uVar23;
            auVar222 = ZEXT3264(auVar208);
            if (local_310 == 0) {
LAB_01d89110:
              local_310 = 0;
            }
            else {
              auVar66._4_4_ = auVar111._4_4_ * auVar110._4_4_;
              auVar66._0_4_ = auVar111._0_4_ * auVar110._0_4_;
              auVar66._8_4_ = auVar111._8_4_ * auVar110._8_4_;
              auVar66._12_4_ = auVar111._12_4_ * auVar110._12_4_;
              auVar66._16_4_ = auVar111._16_4_ * auVar110._16_4_;
              auVar66._20_4_ = auVar111._20_4_ * auVar110._20_4_;
              auVar66._24_4_ = auVar111._24_4_ * auVar110._24_4_;
              auVar66._28_4_ = auVar112._28_4_;
              auVar213 = vfmsub231ps_fma(auVar66,auVar113,auVar123);
              auVar67._4_4_ = auVar123._4_4_ * auVar122._4_4_;
              auVar67._0_4_ = auVar123._0_4_ * auVar122._0_4_;
              auVar67._8_4_ = auVar123._8_4_ * auVar122._8_4_;
              auVar67._12_4_ = auVar123._12_4_ * auVar122._12_4_;
              auVar67._16_4_ = auVar123._16_4_ * auVar122._16_4_;
              auVar67._20_4_ = auVar123._20_4_ * auVar122._20_4_;
              auVar67._24_4_ = auVar123._24_4_ * auVar122._24_4_;
              auVar67._28_4_ = auVar123._28_4_;
              auVar100 = vfmsub231ps_fma(auVar67,auVar121,auVar111);
              auVar68._4_4_ = auVar113._4_4_ * auVar121._4_4_;
              auVar68._0_4_ = auVar113._0_4_ * auVar121._0_4_;
              auVar68._8_4_ = auVar113._8_4_ * auVar121._8_4_;
              auVar68._12_4_ = auVar113._12_4_ * auVar121._12_4_;
              auVar68._16_4_ = auVar113._16_4_ * auVar121._16_4_;
              auVar68._20_4_ = auVar113._20_4_ * auVar121._20_4_;
              auVar68._24_4_ = auVar113._24_4_ * auVar121._24_4_;
              auVar68._28_4_ = auVar113._28_4_;
              auVar6 = vfmsub231ps_fma(auVar68,auVar122,auVar110);
              auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar100),ZEXT1632(auVar6));
              auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar213),auVar120);
              auVar110 = vrcp14ps_avx512vl(auVar112);
              auVar30._8_4_ = 0x3f800000;
              auVar30._0_8_ = &DAT_3f8000003f800000;
              auVar30._12_4_ = 0x3f800000;
              auVar30._16_4_ = 0x3f800000;
              auVar30._20_4_ = 0x3f800000;
              auVar30._24_4_ = 0x3f800000;
              auVar30._28_4_ = 0x3f800000;
              auVar123 = vfnmadd213ps_avx512vl(auVar110,auVar112,auVar30);
              auVar102 = vfmadd132ps_fma(auVar123,auVar110,auVar110);
              auVar69._4_4_ = auVar6._4_4_ * auVar140._4_4_;
              auVar69._0_4_ = auVar6._0_4_ * auVar140._0_4_;
              auVar69._8_4_ = auVar6._8_4_ * auVar140._8_4_;
              auVar69._12_4_ = auVar6._12_4_ * auVar140._12_4_;
              auVar69._16_4_ = fVar190 * 0.0;
              auVar69._20_4_ = fVar154 * 0.0;
              auVar69._24_4_ = fVar185 * 0.0;
              auVar69._28_4_ = iVar1;
              auVar100 = vfmadd231ps_fma(auVar69,auVar115,ZEXT1632(auVar100));
              auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar114,ZEXT1632(auVar213));
              fVar185 = auVar102._0_4_;
              fVar154 = auVar102._4_4_;
              fVar190 = auVar102._8_4_;
              fVar191 = auVar102._12_4_;
              auVar110 = ZEXT1632(CONCAT412(auVar100._12_4_ * fVar191,
                                            CONCAT48(auVar100._8_4_ * fVar190,
                                                     CONCAT44(auVar100._4_4_ * fVar154,
                                                              auVar100._0_4_ * fVar185))));
              auVar83._4_4_ = uStack_1dc;
              auVar83._0_4_ = local_1e0;
              auVar83._8_4_ = uStack_1d8;
              auVar83._12_4_ = uStack_1d4;
              auVar83._16_4_ = uStack_1d0;
              auVar83._20_4_ = uStack_1cc;
              auVar83._24_4_ = uStack_1c8;
              auVar83._28_4_ = uStack_1c4;
              uVar23 = vcmpps_avx512vl(auVar110,auVar83,0xd);
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar155;
              auVar31._0_4_ = uVar155;
              auVar31._8_4_ = uVar155;
              auVar31._12_4_ = uVar155;
              auVar31._16_4_ = uVar155;
              auVar31._20_4_ = uVar155;
              auVar31._24_4_ = uVar155;
              auVar31._28_4_ = uVar155;
              uVar24 = vcmpps_avx512vl(auVar110,auVar31,2);
              local_310 = (byte)uVar23 & (byte)uVar24 & local_310;
              if (local_310 == 0) goto LAB_01d89110;
              uVar23 = vcmpps_avx512vl(auVar112,auVar120,4);
              if ((local_310 & (byte)uVar23) == 0) goto LAB_01d89110;
              local_310 = local_310 & (byte)uVar23;
              fVar175 = auVar116._0_4_ * fVar185;
              fVar182 = auVar116._4_4_ * fVar154;
              auVar70._4_4_ = fVar182;
              auVar70._0_4_ = fVar175;
              fVar183 = auVar116._8_4_ * fVar190;
              auVar70._8_4_ = fVar183;
              fVar184 = auVar116._12_4_ * fVar191;
              auVar70._12_4_ = fVar184;
              fVar174 = auVar116._16_4_ * 0.0;
              auVar70._16_4_ = fVar174;
              fVar98 = auVar116._20_4_ * 0.0;
              auVar70._20_4_ = fVar98;
              fVar99 = auVar116._24_4_ * 0.0;
              auVar70._24_4_ = fVar99;
              auVar70._28_4_ = auVar116._28_4_;
              fVar185 = auVar109._0_4_ * fVar185;
              fVar154 = auVar109._4_4_ * fVar154;
              auVar71._4_4_ = fVar154;
              auVar71._0_4_ = fVar185;
              fVar190 = auVar109._8_4_ * fVar190;
              auVar71._8_4_ = fVar190;
              fVar191 = auVar109._12_4_ * fVar191;
              auVar71._12_4_ = fVar191;
              fVar148 = auVar109._16_4_ * 0.0;
              auVar71._16_4_ = fVar148;
              fVar149 = auVar109._20_4_ * 0.0;
              auVar71._20_4_ = fVar149;
              fVar150 = auVar109._24_4_ * 0.0;
              auVar71._24_4_ = fVar150;
              auVar71._28_4_ = auVar109._28_4_;
              auVar199._8_4_ = 0x3f800000;
              auVar199._0_8_ = &DAT_3f8000003f800000;
              auVar199._12_4_ = 0x3f800000;
              auVar199._16_4_ = 0x3f800000;
              auVar199._20_4_ = 0x3f800000;
              auVar199._24_4_ = 0x3f800000;
              auVar199._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar199,auVar70);
              local_5e0._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar175 | (uint)!(bool)(bVar96 & 1) * auVar112._0_4_;
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              local_5e0._4_4_ = (uint)bVar16 * (int)fVar182 | (uint)!bVar16 * auVar112._4_4_;
              bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
              local_5e0._8_4_ = (uint)bVar16 * (int)fVar183 | (uint)!bVar16 * auVar112._8_4_;
              bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
              local_5e0._12_4_ = (uint)bVar16 * (int)fVar184 | (uint)!bVar16 * auVar112._12_4_;
              bVar16 = (bool)((byte)(uVar86 >> 4) & 1);
              local_5e0._16_4_ = (uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar112._16_4_;
              bVar16 = (bool)((byte)(uVar86 >> 5) & 1);
              local_5e0._20_4_ = (uint)bVar16 * (int)fVar98 | (uint)!bVar16 * auVar112._20_4_;
              bVar16 = (bool)((byte)(uVar86 >> 6) & 1);
              local_5e0._24_4_ = (uint)bVar16 * (int)fVar99 | (uint)!bVar16 * auVar112._24_4_;
              bVar16 = SUB81(uVar86 >> 7,0);
              local_5e0._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar112._28_4_;
              auVar112 = vsubps_avx(auVar199,auVar71);
              bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar86 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar86 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar86 >> 6) & 1);
              bVar22 = SUB81(uVar86 >> 7,0);
              local_200._4_4_ = (uint)bVar16 * (int)fVar154 | (uint)!bVar16 * auVar112._4_4_;
              local_200._0_4_ =
                   (uint)(bVar96 & 1) * (int)fVar185 | (uint)!(bool)(bVar96 & 1) * auVar112._0_4_;
              local_200._8_4_ = (uint)bVar17 * (int)fVar190 | (uint)!bVar17 * auVar112._8_4_;
              local_200._12_4_ = (uint)bVar18 * (int)fVar191 | (uint)!bVar18 * auVar112._12_4_;
              local_200._16_4_ = (uint)bVar19 * (int)fVar148 | (uint)!bVar19 * auVar112._16_4_;
              local_200._20_4_ = (uint)bVar20 * (int)fVar149 | (uint)!bVar20 * auVar112._20_4_;
              local_200._24_4_ = (uint)bVar21 * (int)fVar150 | (uint)!bVar21 * auVar112._24_4_;
              local_200._28_4_ = (uint)bVar22 * auVar109._28_4_ | (uint)!bVar22 * auVar112._28_4_;
              local_600 = auVar110;
            }
            if (local_310 != 0) {
              auVar112 = vsubps_avx(auVar119,auVar118);
              auVar102 = vfmadd213ps_fma(auVar112,local_5e0,auVar118);
              uVar155 = *(undefined4 *)((long)local_6a8->ray_space + k * 4 + -0x10);
              auVar32._4_4_ = uVar155;
              auVar32._0_4_ = uVar155;
              auVar32._8_4_ = uVar155;
              auVar32._12_4_ = uVar155;
              auVar32._16_4_ = uVar155;
              auVar32._20_4_ = uVar155;
              auVar32._24_4_ = uVar155;
              auVar32._28_4_ = uVar155;
              auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar102._12_4_ + auVar102._12_4_,
                                                            CONCAT48(auVar102._8_4_ + auVar102._8_4_
                                                                     ,CONCAT44(auVar102._4_4_ +
                                                                               auVar102._4_4_,
                                                                               auVar102._0_4_ +
                                                                               auVar102._0_4_)))),
                                         auVar32);
              uVar23 = vcmpps_avx512vl(local_600,auVar112,6);
              local_310 = local_310 & (byte)uVar23;
              uVar91 = (uint)local_310;
              if (local_310 != 0) {
                auVar163._8_4_ = 0xbf800000;
                auVar163._0_8_ = 0xbf800000bf800000;
                auVar163._12_4_ = 0xbf800000;
                auVar163._16_4_ = 0xbf800000;
                auVar163._20_4_ = 0xbf800000;
                auVar163._24_4_ = 0xbf800000;
                auVar163._28_4_ = 0xbf800000;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3a0 = vfmadd132ps_avx512vl(local_200,auVar163,auVar33);
                local_200 = local_3a0;
                auVar112 = local_200;
                local_360 = (undefined4)lVar92;
                local_350 = local_6a0._0_8_;
                uStack_348 = local_6a0._8_8_;
                local_340 = local_610._0_8_;
                uStack_338 = local_610._8_8_;
                local_330 = local_630._0_8_;
                uStack_328 = local_630._8_8_;
                local_320 = local_620;
                uStack_318 = uStack_618;
                pGVar94 = (context->scene->geometries).items[uVar95].ptr;
                local_200 = auVar112;
                if ((pGVar94->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar102 = vcvtsi2ss_avx512f(auVar134._0_16_,local_360);
                  fVar185 = auVar102._0_4_;
                  local_300[0] = (fVar185 + local_5e0._0_4_ + 0.0) * (float)local_3e0._0_4_;
                  local_300[1] = (fVar185 + local_5e0._4_4_ + 1.0) * (float)local_3e0._4_4_;
                  local_300[2] = (fVar185 + local_5e0._8_4_ + 2.0) * fStack_3d8;
                  local_300[3] = (fVar185 + local_5e0._12_4_ + 3.0) * fStack_3d4;
                  fStack_2f0 = (fVar185 + local_5e0._16_4_ + 4.0) * fStack_3d0;
                  fStack_2ec = (fVar185 + local_5e0._20_4_ + 5.0) * fStack_3cc;
                  fStack_2e8 = (fVar185 + local_5e0._24_4_ + 6.0) * fStack_3c8;
                  fStack_2e4 = fVar185 + local_5e0._28_4_ + 7.0;
                  local_200._0_8_ = local_3a0._0_8_;
                  local_200._8_8_ = local_3a0._8_8_;
                  local_200._16_8_ = local_3a0._16_8_;
                  local_200._24_8_ = local_3a0._24_8_;
                  local_2e0 = local_200._0_8_;
                  uStack_2d8 = local_200._8_8_;
                  uStack_2d0 = local_200._16_8_;
                  uStack_2c8 = local_200._24_8_;
                  local_2c0 = local_600;
                  auVar164._8_4_ = 0x7f800000;
                  auVar164._0_8_ = 0x7f8000007f800000;
                  auVar164._12_4_ = 0x7f800000;
                  auVar164._16_4_ = 0x7f800000;
                  auVar164._20_4_ = 0x7f800000;
                  auVar164._24_4_ = 0x7f800000;
                  auVar164._28_4_ = 0x7f800000;
                  auVar112 = vblendmps_avx512vl(auVar164,local_600);
                  auVar145._0_4_ =
                       (uint)(local_310 & 1) * auVar112._0_4_ |
                       (uint)!(bool)(local_310 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 1 & 1);
                  auVar145._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 2 & 1);
                  auVar145._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 3 & 1);
                  auVar145._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 4 & 1);
                  auVar145._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 5 & 1);
                  auVar145._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_310 >> 6 & 1);
                  auVar145._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar145._28_4_ =
                       (uint)(local_310 >> 7) * auVar112._28_4_ |
                       (uint)!(bool)(local_310 >> 7) * 0x7f800000;
                  auVar112 = vshufps_avx(auVar145,auVar145,0xb1);
                  auVar112 = vminps_avx(auVar145,auVar112);
                  auVar110 = vshufpd_avx(auVar112,auVar112,5);
                  auVar112 = vminps_avx(auVar112,auVar110);
                  auVar110 = vpermpd_avx2(auVar112,0x4e);
                  auVar112 = vminps_avx(auVar112,auVar110);
                  uVar23 = vcmpps_avx512vl(auVar145,auVar112,0);
                  bVar85 = (byte)uVar23 & local_310;
                  bVar96 = local_310;
                  if (bVar85 != 0) {
                    bVar96 = bVar85;
                  }
                  uVar88 = 0;
                  for (uVar89 = (uint)bVar96; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000)
                  {
                    uVar88 = uVar88 + 1;
                  }
                  uVar86 = (ulong)uVar88;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar94->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar185 = local_300[uVar86];
                    uVar155 = *(undefined4 *)((long)&local_2e0 + uVar86 * 4);
                    fVar190 = 1.0 - fVar185;
                    fVar154 = fVar190 * fVar190 * -3.0;
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),
                                               ZEXT416((uint)(fVar185 * fVar190)),
                                               ZEXT416(0xc0000000));
                    auVar100 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar190)),
                                               ZEXT416((uint)(fVar185 * fVar185)),
                                               ZEXT416(0x40000000));
                    fVar190 = auVar102._0_4_ * 3.0;
                    fVar191 = auVar100._0_4_ * 3.0;
                    fVar175 = fVar185 * fVar185 * 3.0;
                    auVar193._0_4_ = fVar175 * (float)local_620._0_4_;
                    auVar193._4_4_ = fVar175 * (float)local_620._4_4_;
                    auVar193._8_4_ = fVar175 * (float)uStack_618;
                    auVar193._12_4_ = fVar175 * uStack_618._4_4_;
                    auVar172._4_4_ = fVar191;
                    auVar172._0_4_ = fVar191;
                    auVar172._8_4_ = fVar191;
                    auVar172._12_4_ = fVar191;
                    auVar102 = vfmadd132ps_fma(auVar172,auVar193,local_630);
                    auVar177._4_4_ = fVar190;
                    auVar177._0_4_ = fVar190;
                    auVar177._8_4_ = fVar190;
                    auVar177._12_4_ = fVar190;
                    auVar102 = vfmadd132ps_fma(auVar177,auVar102,local_610);
                    auVar173._4_4_ = fVar154;
                    auVar173._0_4_ = fVar154;
                    auVar173._8_4_ = fVar154;
                    auVar173._12_4_ = fVar154;
                    auVar102 = vfmadd132ps_fma(auVar173,auVar102,local_6a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar86 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar102._0_4_;
                    uVar3 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                    uVar3 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar3;
                    *(float *)(ray + k * 4 + 0xf0) = fVar185;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar155;
                    *(uint *)(ray + k * 4 + 0x110) = uVar12;
                    *(uint *)(ray + k * 4 + 0x120) = uVar95;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_4e0 = local_610._0_8_;
                    uStack_4d8 = local_610._8_8_;
                    local_4f0 = local_630._0_8_;
                    uStack_4e8 = local_630._8_8_;
                    local_500 = local_620;
                    uStack_4f8 = uStack_618;
                    local_1a0 = vmovdqa64_avx512vl(auVar223._0_32_);
                    local_658 = pGVar94;
                    local_3c0 = local_5e0;
                    local_380 = local_600;
                    local_35c = iVar13;
                    do {
                      auVar213 = auVar214._0_16_;
                      local_4d0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_260 = local_300[uVar86];
                      local_250 = *(undefined4 *)((long)&local_2e0 + uVar86 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar86 * 4);
                      local_688.context = context->user;
                      fVar154 = 1.0 - local_260;
                      fVar185 = fVar154 * fVar154 * -3.0;
                      auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar154 * fVar154)),
                                                 ZEXT416((uint)(local_260 * fVar154)),
                                                 ZEXT416(0xc0000000));
                      auVar100 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar154)),
                                                 ZEXT416((uint)(local_260 * local_260)),
                                                 ZEXT416(0x40000000));
                      fVar154 = auVar102._0_4_ * 3.0;
                      fVar190 = auVar100._0_4_ * 3.0;
                      fVar191 = local_260 * local_260 * 3.0;
                      auVar194._0_4_ = fVar191 * (float)local_500;
                      auVar194._4_4_ = fVar191 * local_500._4_4_;
                      auVar194._8_4_ = fVar191 * (float)uStack_4f8;
                      auVar194._12_4_ = fVar191 * uStack_4f8._4_4_;
                      auVar156._4_4_ = fVar190;
                      auVar156._0_4_ = fVar190;
                      auVar156._8_4_ = fVar190;
                      auVar156._12_4_ = fVar190;
                      auVar78._8_8_ = uStack_4e8;
                      auVar78._0_8_ = local_4f0;
                      auVar102 = vfmadd132ps_fma(auVar156,auVar194,auVar78);
                      auVar178._4_4_ = fVar154;
                      auVar178._0_4_ = fVar154;
                      auVar178._8_4_ = fVar154;
                      auVar178._12_4_ = fVar154;
                      auVar80._8_8_ = uStack_4d8;
                      auVar80._0_8_ = local_4e0;
                      auVar102 = vfmadd132ps_fma(auVar178,auVar102,auVar80);
                      auVar157._4_4_ = fVar185;
                      auVar157._0_4_ = fVar185;
                      auVar157._8_4_ = fVar185;
                      auVar157._12_4_ = fVar185;
                      auVar102 = vfmadd132ps_fma(auVar157,auVar102,local_6a0);
                      local_290 = auVar102._0_4_;
                      local_280 = vshufps_avx(auVar102,auVar102,0x55);
                      local_270 = vshufps_avx(auVar102,auVar102,0xaa);
                      iStack_28c = local_290;
                      iStack_288 = local_290;
                      iStack_284 = local_290;
                      fStack_25c = local_260;
                      fStack_258 = local_260;
                      fStack_254 = local_260;
                      uStack_24c = local_250;
                      uStack_248 = local_250;
                      uStack_244 = local_250;
                      local_240 = local_4c0._0_8_;
                      uStack_238 = local_4c0._8_8_;
                      local_230 = local_640;
                      vpcmpeqd_avx2(ZEXT1632(local_640),ZEXT1632(local_640));
                      uStack_21c = (local_688.context)->instID[0];
                      local_220 = uStack_21c;
                      uStack_218 = uStack_21c;
                      uStack_214 = uStack_21c;
                      uStack_210 = (local_688.context)->instPrimID[0];
                      uStack_20c = uStack_210;
                      uStack_208 = uStack_210;
                      uStack_204 = uStack_210;
                      local_6c0 = local_3f0._0_8_;
                      uStack_6b8 = local_3f0._8_8_;
                      local_688.valid = (int *)&local_6c0;
                      local_688.geometryUserPtr = pGVar94->userPtr;
                      local_688.hit = (RTCHitN *)&local_290;
                      local_688.N = 4;
                      local_650._0_4_ = uVar91;
                      local_688.ray = (RTCRayN *)ray;
                      if (pGVar94->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar94->intersectionFilterN)(&local_688);
                        auVar112 = vmovdqa64_avx512vl(local_1a0);
                        auVar223 = ZEXT3264(auVar112);
                        auVar221 = ZEXT3264(local_580);
                        auVar220 = ZEXT3264(local_560);
                        auVar219 = ZEXT3264(local_540);
                        auVar218 = ZEXT3264(local_520);
                        auVar222 = ZEXT3264(local_480);
                        auVar217 = ZEXT3264(local_460);
                        auVar216 = ZEXT3264(local_440);
                        auVar215 = ZEXT3264(local_420);
                        auVar102 = vxorps_avx512vl(auVar213,auVar213);
                        auVar214 = ZEXT1664(auVar102);
                        pGVar94 = local_658;
                        uVar91 = local_650._0_4_;
                      }
                      bVar96 = (byte)uVar91;
                      auVar102 = auVar214._0_16_;
                      auVar74._8_8_ = uStack_6b8;
                      auVar74._0_8_ = local_6c0;
                      uVar97 = vptestmd_avx512vl(auVar74,auVar74);
                      if ((uVar97 & 0xf) == 0) {
LAB_01d89546:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_4d0._0_4_;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar94->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_688);
                          bVar96 = local_650[0];
                          auVar112 = vmovdqa64_avx512vl(local_1a0);
                          auVar223 = ZEXT3264(auVar112);
                          auVar221 = ZEXT3264(local_580);
                          auVar220 = ZEXT3264(local_560);
                          auVar219 = ZEXT3264(local_540);
                          auVar218 = ZEXT3264(local_520);
                          auVar222 = ZEXT3264(local_480);
                          auVar217 = ZEXT3264(local_460);
                          auVar216 = ZEXT3264(local_440);
                          auVar215 = ZEXT3264(local_420);
                          auVar102 = vxorps_avx512vl(auVar102,auVar102);
                          auVar214 = ZEXT1664(auVar102);
                          pGVar94 = local_658;
                        }
                        auVar75._8_8_ = uStack_6b8;
                        auVar75._0_8_ = local_6c0;
                        uVar97 = vptestmd_avx512vl(auVar75,auVar75);
                        uVar97 = uVar97 & 0xf;
                        bVar85 = (byte)uVar97;
                        if (bVar85 == 0) goto LAB_01d89546;
                        iVar1 = *(int *)(local_688.hit + 4);
                        iVar2 = *(int *)(local_688.hit + 8);
                        iVar73 = *(int *)(local_688.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_688.ray + 0xc0) =
                             (uint)(bVar85 & 1) * *(int *)local_688.hit |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xc0);
                        *(uint *)(local_688.ray + 0xc4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xc4);
                        *(uint *)(local_688.ray + 200) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 200);
                        *(uint *)(local_688.ray + 0xcc) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xcc);
                        iVar1 = *(int *)(local_688.hit + 0x14);
                        iVar2 = *(int *)(local_688.hit + 0x18);
                        iVar73 = *(int *)(local_688.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_688.ray + 0xd0) =
                             (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x10) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xd0);
                        *(uint *)(local_688.ray + 0xd4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xd4);
                        *(uint *)(local_688.ray + 0xd8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xd8);
                        *(uint *)(local_688.ray + 0xdc) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xdc);
                        iVar1 = *(int *)(local_688.hit + 0x24);
                        iVar2 = *(int *)(local_688.hit + 0x28);
                        iVar73 = *(int *)(local_688.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_688.ray + 0xe0) =
                             (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x20) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xe0);
                        *(uint *)(local_688.ray + 0xe4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xe4);
                        *(uint *)(local_688.ray + 0xe8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xe8);
                        *(uint *)(local_688.ray + 0xec) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xec);
                        iVar1 = *(int *)(local_688.hit + 0x34);
                        iVar2 = *(int *)(local_688.hit + 0x38);
                        iVar73 = *(int *)(local_688.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar97 >> 2) & 1);
                        bVar18 = SUB81(uVar97 >> 3,0);
                        *(uint *)(local_688.ray + 0xf0) =
                             (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x30) |
                             (uint)!(bool)(bVar85 & 1) * *(int *)(local_688.ray + 0xf0);
                        *(uint *)(local_688.ray + 0xf4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_688.ray + 0xf4);
                        *(uint *)(local_688.ray + 0xf8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_688.ray + 0xf8);
                        *(uint *)(local_688.ray + 0xfc) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_688.ray + 0xfc);
                        auVar102 = *(undefined1 (*) [16])(local_688.ray + 0x100);
                        auVar105._0_4_ =
                             (uint)(bVar85 & 1) * *(int *)(local_688.hit + 0x40) |
                             (uint)!(bool)(bVar85 & 1) * auVar102._0_4_;
                        bVar16 = (bool)((byte)(uVar97 >> 1) & 1);
                        auVar105._4_4_ =
                             (uint)bVar16 * *(int *)(local_688.hit + 0x44) |
                             (uint)!bVar16 * auVar102._4_4_;
                        bVar16 = (bool)((byte)(uVar97 >> 2) & 1);
                        auVar105._8_4_ =
                             (uint)bVar16 * *(int *)(local_688.hit + 0x48) |
                             (uint)!bVar16 * auVar102._8_4_;
                        bVar16 = SUB81(uVar97 >> 3,0);
                        auVar105._12_4_ =
                             (uint)bVar16 * *(int *)(local_688.hit + 0x4c) |
                             (uint)!bVar16 * auVar102._12_4_;
                        *(undefined1 (*) [16])(local_688.ray + 0x100) = auVar105;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x50));
                        *(undefined1 (*) [16])(local_688.ray + 0x110) = auVar102;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x60));
                        *(undefined1 (*) [16])(local_688.ray + 0x120) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x70));
                        *(undefined1 (*) [16])(local_688.ray + 0x130) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_688.hit + 0x80));
                        *(undefined1 (*) [16])(local_688.ray + 0x140) = auVar102;
                      }
                      bVar96 = ~(byte)(1 << ((uint)uVar86 & 0x1f)) & bVar96;
                      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar34._4_4_ = uVar155;
                      auVar34._0_4_ = uVar155;
                      auVar34._8_4_ = uVar155;
                      auVar34._12_4_ = uVar155;
                      auVar34._16_4_ = uVar155;
                      auVar34._20_4_ = uVar155;
                      auVar34._24_4_ = uVar155;
                      auVar34._28_4_ = uVar155;
                      uVar23 = vcmpps_avx512vl(local_600,auVar34,2);
                      bVar85 = bVar96 & (byte)uVar23;
                      uVar91 = (uint)bVar85;
                      if ((bVar96 & (byte)uVar23) != 0) {
                        auVar165._8_4_ = 0x7f800000;
                        auVar165._0_8_ = 0x7f8000007f800000;
                        auVar165._12_4_ = 0x7f800000;
                        auVar165._16_4_ = 0x7f800000;
                        auVar165._20_4_ = 0x7f800000;
                        auVar165._24_4_ = 0x7f800000;
                        auVar165._28_4_ = 0x7f800000;
                        auVar112 = vblendmps_avx512vl(auVar165,local_600);
                        auVar146._0_4_ =
                             (uint)(bVar85 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar85 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar85 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar85 >> 7) * auVar112._28_4_ |
                             (uint)!(bool)(bVar85 >> 7) * 0x7f800000;
                        auVar112 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar112 = vminps_avx(auVar146,auVar112);
                        auVar110 = vshufpd_avx(auVar112,auVar112,5);
                        auVar112 = vminps_avx(auVar112,auVar110);
                        auVar110 = vpermpd_avx2(auVar112,0x4e);
                        auVar112 = vminps_avx(auVar112,auVar110);
                        uVar23 = vcmpps_avx512vl(auVar146,auVar112,0);
                        bVar96 = (byte)uVar23 & bVar85;
                        uVar88 = uVar91;
                        if (bVar96 != 0) {
                          uVar88 = (uint)bVar96;
                        }
                        uVar89 = 0;
                        for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                          uVar89 = uVar89 + 1;
                        }
                        uVar86 = (ulong)uVar89;
                      }
                    } while (bVar85 != 0);
                  }
                }
              }
            }
          }
          lVar92 = lVar92 + 8;
        } while ((int)lVar92 < iVar13);
      }
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29._4_4_ = uVar155;
      auVar29._0_4_ = uVar155;
      auVar29._8_4_ = uVar155;
      auVar29._12_4_ = uVar155;
      auVar29._16_4_ = uVar155;
      auVar29._20_4_ = uVar155;
      auVar29._24_4_ = uVar155;
      auVar29._28_4_ = uVar155;
      uVar23 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar95 = (uint)uVar93 & (uint)uVar93 + 0xff & (uint)uVar23;
      uVar93 = (ulong)uVar95;
    } while (uVar95 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }